

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

int pbrt::RandomWalk(Integrator *integrator,SampledWavelengths *lambda,RayDifferential *ray,
                    SamplerHandle *sampler,CameraHandle *camera,ScratchBuffer *scratchBuffer,
                    SampledSpectrum beta,Float pdf,int maxDepth,TransportMode mode,Vertex *path,
                    bool regularize)

{
  int *piVar1;
  int *piVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  Interval IVar4;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  TVar6;
  uintptr_t uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  short sVar100;
  ushort uVar101;
  Vector3f woRender;
  Point3f p;
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  Interval IVar105;
  undefined1 auVar106 [64];
  undefined4 uVar107;
  byte bVar108;
  int *piVar109;
  uintptr_t iptr;
  long lVar110;
  ulong uVar111;
  undefined8 *puVar112;
  DebugMLTSampler *this;
  PrimitiveHandle *this_00;
  int iVar113;
  int iVar114;
  DenselySampledSpectrum *this_01;
  float *pfVar115;
  int *piVar116;
  int *piVar117;
  uint uVar118;
  float *pfVar119;
  float *pfVar120;
  float *pfVar121;
  float *pfVar122;
  uint64_t oldstate;
  ulong uVar123;
  long in_FS_OFFSET;
  bool bVar124;
  char cVar125;
  ulong uVar126;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  int iVar127;
  undefined1 auVar136 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar137 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  Float FVar149;
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 extraout_var [12];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  Tuple2<pbrt::Point2,_float> u2;
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar179 [64];
  float fVar192;
  float fVar193;
  undefined8 uVar189;
  undefined1 auVar191 [56];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined8 uVar190;
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar177 [32];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar178 [32];
  undefined1 auVar187 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar188 [64];
  float fVar240;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar238;
  float fVar244;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar239;
  float fVar241;
  float fVar245;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined8 uVar242;
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  float fVar246;
  float fVar270;
  float fVar271;
  float fVar272;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined4 uVar273;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  Float t0;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [64];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [64];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [64];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [64];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 in_ZMM10 [64];
  undefined1 in_ZMM12 [64];
  undefined1 in_XMM14 [16];
  SampledSpectrum SVar325;
  Point3f p_00;
  Vector3f woRender_00;
  Vector3f wi;
  Vector3f wiRender;
  bool scattered;
  bool anyNonSpecularBounces;
  bool terminated;
  Float pdfFwd;
  optional<pbrt::BSDFSample> bs;
  Float nextCrossingT [3];
  int voxel [3];
  int step [3];
  Float deltaT [3];
  BSDF bsdf;
  int voxelLimit [3];
  Vertex v;
  optional<pbrt::ShapeIntersection> si;
  bool local_613;
  bool local_612;
  bool local_611;
  float local_610;
  int local_60c;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  Float local_5ec;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  undefined1 local_5d8 [8];
  float fStack_5d0;
  float afStack_5cc [8];
  bool local_5ac;
  float local_59c [3];
  undefined8 local_590;
  undefined8 *local_588;
  Point3f local_580;
  int local_574 [3];
  float local_568;
  float fStack_564;
  float fStack_560;
  float fStack_55c;
  Vertex *local_550;
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  undefined8 uStack_530;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  undefined1 local_518 [16];
  float local_504;
  Vertex *local_500;
  undefined1 local_4f8 [16];
  SampledSpectrum local_4e8;
  undefined1 local_4d8 [16];
  undefined1 local_4c0 [20];
  float fStack_4ac;
  Float FStack_4a8;
  MediumHandle local_4a0;
  int aiStack_498 [3];
  float afStack_48c [3];
  anon_class_88_11_14aa307c local_480;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  PrimitiveHandle *local_408;
  RayDifferential *local_400;
  SamplerHandle *local_3f8;
  TransportMode local_3ec;
  int local_3e8;
  int aiStack_3e4 [3];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 auStack_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [16];
  SampledWavelengths *local_330;
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_328;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_320;
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  Interval *local_2e8;
  CameraHandle *local_2e0;
  ScratchBuffer *local_2d8;
  undefined1 local_2d0 [24];
  anon_union_248_3_83785cfc_for_Vertex_2 aStack_2b8;
  BxDFHandle local_1c0;
  undefined1 auStack_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 auStack_198 [16];
  bool local_188;
  undefined8 local_184;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_138;
  ulong local_38;
  undefined1 auVar138 [64];
  undefined1 auVar142 [64];
  undefined1 auVar146 [64];
  undefined1 auVar128 [16];
  undefined1 auVar184 [64];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar233 [64];
  undefined1 auVar243 [56];
  
  uVar189 = CONCAT44(aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x,
                     aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z);
  auVar314._8_56_ = beta._16_56_;
  auVar314._0_8_ = beta.values.values._8_8_;
  auVar304._8_56_ = beta._8_56_;
  auVar304._0_8_ = beta.values.values._0_8_;
  local_2d8 = scratchBuffer;
  local_2e0 = camera;
  local_4e8.values.values = (array<float,_4>)vmovlhps_avx(auVar304._0_16_,auVar314._0_16_);
  if (maxDepth == 0) {
    local_3e8 = 0;
  }
  else {
    local_60c = 0;
    local_612 = false;
    local_5ec = pdf;
    this_00 = &integrator->aggregate;
    local_3ec = (uint)(mode == Radiance);
    local_2e8 = (Interval *)&ray->hasDifferentials;
    local_3f8 = sampler;
    local_400 = ray;
    local_330 = lambda;
    local_408 = this_00;
    do {
      if ((local_4e8.values.values[0] == 0.0) && (!NAN(local_4e8.values.values[0]))) {
        uVar123 = 0;
        while (uVar111 = uVar123, uVar111 != 3) {
          fVar193 = local_4e8.values.values[uVar111 + 1];
          if ((fVar193 != 0.0) || (uVar123 = uVar111 + 1, NAN(fVar193))) break;
        }
        if (2 < uVar111) goto LAB_004076f2;
      }
      local_613 = false;
      local_611 = false;
      lVar110 = (long)local_60c;
      *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
      if (((this_00->
           super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
           ).bits & 0xffffffffffff) == 0) {
        in_ZmmResult = ZEXT464(0) << 0x20;
        local_138._192_64_ = in_ZmmResult;
        local_138._128_4_ = in_ZmmResult._0_4_;
        local_138._128_4_ = 0.0;
        local_138._132_4_ = 0.0;
        local_138._136_4_ = 0.0;
        local_138._140_4_ = 0.0;
        local_138._144_8_ = 0;
        local_138._152_8_ = 0;
        local_138._160_8_ = 0;
        local_138._168_8_ = 0;
        local_138._176_8_ = 0;
        local_138._184_8_ = 0;
        local_138._64_8_ = in_ZmmResult._0_8_;
        local_138._64_8_ = 0;
        local_138._72_8_ = 0;
        local_138._80_48_ = (undefined1  [48])0x0;
        local_138._0_64_ = in_ZmmResult;
        local_38 = 0;
      }
      else {
        in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
        in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
        aStack_2b8._48_8_ = uVar189;
        PrimitiveHandle::Intersect
                  ((optional<pbrt::ShapeIntersection> *)&local_138.__align,this_00,&ray->super_Ray,
                   INFINITY);
        uVar189 = aStack_2b8._48_8_;
      }
      local_550 = path + lVar110;
      local_500 = path + lVar110 + -1;
      if (((ray->super_Ray).medium.
           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
           .bits & 0xffffffffffff) == 0) {
        auVar131._8_4_ = 0x80000000;
        auVar131._0_8_ = 0x8000000080000000;
        auVar131._12_4_ = 0x80000000;
      }
      else {
        _local_608 = ZEXT416((uint)((byte)local_38 & 1) * local_138._248_4_ +
                             (uint)!(bool)((byte)local_38 & 1) * 0x7f800000);
        fVar193 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        fVar239 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        uVar123 = (sampler->
                  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
        local_2d0._0_4_ = (undefined4)uVar123;
        local_2d0._4_4_ = (undefined4)(uVar123 >> 0x20);
        in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
        in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
        aStack_2b8._48_8_ = uVar189;
        FVar149 = DispatchSplit<9>::operator()
                            ((DispatchSplit<9> *)&local_480,local_2d0,uVar123 >> 0x30);
        uVar123 = ((ulong)(uint)fVar193 ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
        uVar123 = (uVar123 >> 0x2f ^ uVar123) * -0x395b586ca42e166b;
        uVar123 = uVar123 >> 0x2f ^ uVar123;
        uVar111 = ((ulong)(uint)fVar239 ^ 0x1a929e4d6f47a654) * -0x395b586ca42e166b;
        uVar111 = (uVar111 >> 0x2f ^ uVar111) * -0x395b586ca42e166b;
        local_3c8 = (undefined1  [8])(uVar123 * 2 + 1);
        uVar123 = ((uVar111 >> 0x2f ^ uVar111) + 1) * 0x5851f42d4c957f2d +
                  uVar123 * -0x4f5c17a566d501a4 + 1;
        uVar3 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        uVar5 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        auVar128._4_4_ = uVar5;
        auVar128._0_4_ = uVar3;
        auVar128._8_8_ = 0;
        fVar193 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        uVar111._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        uVar111._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar130._8_8_ = 0;
        auVar130._0_8_ = uVar111;
        uVar126 = *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = uVar126;
        TVar6.bits = (ray->super_Ray).medium.
                     super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                     .bits;
        local_518._0_4_ = FVar149;
        sVar100 = (short)(TVar6.bits >> 0x30);
        local_588 = (undefined8 *)TVar6.bits;
        local_480.sampler = sampler;
        local_480.ray = ray;
        if (TVar6.bits < (undefined8 *)0x3000000000000) {
          if (sVar100 == 2) {
            local_4c0._0_8_ = vmovlps_avx(auVar128);
            unique0x000f4700 = vmovlhps_avx(auVar130,auVar132);
            local_480.terminated = &local_611;
            local_480.beta = &local_4e8;
            local_480.vertex = local_550;
            local_480.pdfFwd = &local_5ec;
            local_480.prev = local_500;
            local_480.bounces = &local_60c;
            local_480.maxDepth = &maxDepth;
            local_480.anyNonSpecularBounces = &local_612;
            local_480.scattered = &local_613;
            local_610 = (float)local_608._0_4_;
            puVar112 = (undefined8 *)(TVar6.bits & 0xffffffffffff);
            local_4c0._8_4_ = fVar193;
            local_4a0.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                     )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )TVar6.bits;
            Transform::ApplyInverse
                      ((Ray *)local_5d8,(Transform *)(puVar112 + 0xf),(Ray *)local_4c0,&local_610);
            auVar194._0_4_ = afStack_5cc[1] * afStack_5cc[1];
            auVar194._4_4_ = afStack_5cc[2] * afStack_5cc[2];
            auVar194._8_8_ = 0;
            auVar131 = vmovshdup_avx(auVar194);
            fVar193 = afStack_5cc[0] * afStack_5cc[0] + auVar194._0_4_ + auVar131._0_4_;
            if (fVar193 < 0.0) {
              fVar193 = sqrtf(fVar193);
            }
            else {
              auVar131 = vsqrtss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193));
              fVar193 = auVar131._0_4_;
            }
            local_610 = fVar193 * local_610;
            auVar197._0_4_ = afStack_5cc[1] * afStack_5cc[1];
            auVar197._4_4_ = afStack_5cc[2] * afStack_5cc[2];
            auVar197._8_8_ = 0;
            auVar131 = vmovshdup_avx(auVar197);
            fVar193 = afStack_5cc[0] * afStack_5cc[0] + auVar197._0_4_ + auVar131._0_4_;
            if (fVar193 < 0.0) {
              fVar193 = sqrtf(fVar193);
            }
            else {
              auVar131 = vsqrtss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193));
              fVar193 = auVar131._0_4_;
            }
            auVar131._8_4_ = 0x80000000;
            auVar131._0_8_ = 0x8000000080000000;
            auVar131._12_4_ = 0x80000000;
            auVar199._4_4_ = afStack_5cc[1];
            auVar199._0_4_ = afStack_5cc[0];
            auVar199._8_8_ = 0;
            auVar248._4_4_ = fVar193;
            auVar248._0_4_ = fVar193;
            auVar248._8_4_ = fVar193;
            auVar248._12_4_ = fVar193;
            auVar132 = vdivps_avx(auVar199,auVar248);
            uVar189 = vmovlps_avx(auVar132);
            afStack_5cc[0] = (float)uVar189;
            afStack_5cc[1] = (float)((ulong)uVar189 >> 0x20);
            afStack_5cc[2] = afStack_5cc[2] / fVar193;
            local_568 = local_610;
            auVar132 = ZEXT816(0) << 0x40;
            bVar124 = false;
            uVar118 = 0;
            do {
              pfVar119 = afStack_5cc;
              if ((uVar118 != 0) && (pfVar119 = afStack_5cc + 1, uVar118 != 1)) {
                pfVar119 = afStack_5cc + 2;
              }
              pfVar115 = (float *)(puVar112 + 1);
              if ((uVar118 != 0) && (pfVar115 = (float *)((long)puVar112 + 0xc), uVar118 != 1)) {
                pfVar115 = (float *)(puVar112 + 2);
              }
              pfVar120 = (float *)local_5d8;
              if ((uVar118 != 0) && (pfVar120 = (float *)(local_5d8 + 4), uVar118 != 1)) {
                pfVar120 = &fStack_5d0;
              }
              pfVar121 = (float *)((long)puVar112 + 0x14);
              if ((uVar118 != 0) && (pfVar121 = (float *)(puVar112 + 3), uVar118 != 1)) {
                pfVar121 = (float *)((long)puVar112 + 0x1c);
              }
              pfVar122 = (float *)local_5d8;
              if ((uVar118 != 0) && (pfVar122 = (float *)(local_5d8 + 4), uVar118 != 1)) {
                pfVar122 = &fStack_5d0;
              }
              auVar130 = ZEXT416((uint)((1.0 / *pfVar119) * (*pfVar121 - *pfVar122)));
              auVar155 = ZEXT416((uint)((1.0 / *pfVar119) * (*pfVar115 - *pfVar120)));
              auVar128 = vminss_avx(auVar130,auVar155);
              auVar132 = vmaxss_avx(auVar128,auVar132);
              auVar128 = vmaxss_avx(auVar155,auVar130);
              auVar128 = vminss_avx(ZEXT416((uint)(auVar128._0_4_ * 1.0000004)),
                                    ZEXT416((uint)local_568));
              auVar243 = ZEXT856(auVar128._8_8_);
              local_568 = auVar128._0_4_;
              if (auVar128._0_4_ < auVar132._0_4_) break;
              bVar124 = 1 < uVar118;
              uVar118 = uVar118 + 1;
            } while (uVar118 != 3);
            auVar134._8_4_ = 0x3f800000;
            auVar134._0_8_ = 0x3f8000003f800000;
            auVar134._12_4_ = 0x3f800000;
            if (bVar124) {
              local_5e8._0_4_ = auVar132._0_4_;
              uVar189 = 0;
              _local_608 = ZEXT416(*(uint *)(puVar112 + 0xe));
              SVar325 = DenselySampledSpectrum::Sample
                                  ((DenselySampledSpectrum *)(puVar112 + 4),lambda);
              auVar228._0_8_ = SVar325.values.values._8_8_;
              auVar228._8_56_ = auVar243;
              uStack_530 = uVar189;
              local_538 = (undefined1  [8])SVar325.values.values._0_8_;
              _local_548 = auVar228._0_16_;
              auVar191 = (undefined1  [56])0x0;
              _local_528 = ZEXT416(*(uint *)(puVar112 + 0xe));
              SVar325 = DenselySampledSpectrum::Sample
                                  ((DenselySampledSpectrum *)(puVar112 + 9),lambda);
              auVar229._0_8_ = SVar325.values.values._8_8_;
              auVar229._8_56_ = auVar243;
              auVar181._0_8_ = SVar325.values.values._0_8_;
              auVar181._8_56_ = auVar191;
              auVar131 = vunpcklpd_avx(_local_538,_local_548);
              local_358 = (float)local_608._0_4_ * auVar131._0_4_;
              fStack_354 = (float)local_608._0_4_ * auVar131._4_4_;
              fStack_350 = (float)local_608._0_4_ * auVar131._8_4_;
              fStack_34c = (float)local_608._0_4_ * auVar131._12_4_;
              auVar131 = vmovlhps_avx(auVar181._0_16_,auVar229._0_16_);
              local_368 = (float)local_528._0_4_ * auVar131._0_4_;
              fStack_364 = (float)local_528._0_4_ * auVar131._4_4_;
              fStack_360 = (float)local_528._0_4_ * auVar131._8_4_;
              fStack_35c = (float)local_528._0_4_ * auVar131._12_4_;
              local_318._0_4_ = local_368 + local_358;
              local_318._4_4_ = fStack_364 + fStack_354;
              local_318._8_4_ = fStack_360 + fStack_350;
              local_318._12_4_ = fStack_35c + fStack_34c;
              auVar318 = ZEXT1664(local_318);
              fVar193 = *(float *)(puVar112 + 2);
              fVar245 = *(float *)((long)puVar112 + 0x1c) - fVar193;
              uVar189 = vcmpss_avx512f(ZEXT416((uint)fVar193),
                                       ZEXT416((uint)*(float *)((long)puVar112 + 0x1c)),1);
              bVar11 = (bool)((byte)uVar189 & 1);
              auVar152._8_8_ = 0;
              auVar152._0_8_ = puVar112[1];
              auVar200._8_8_ = 0;
              auVar200._0_8_ = *(ulong *)((long)puVar112 + 0x14);
              auVar131 = vsubps_avx(auVar200,auVar152);
              auVar300._4_4_ = local_5d8._4_4_;
              auVar300._0_4_ = local_5d8._0_4_;
              auVar300._8_8_ = 0;
              auVar132 = vsubps_avx(auVar300,auVar152);
              uVar111 = vcmpps_avx512vl(auVar152,auVar200,1);
              auVar128 = vdivps_avx512vl(auVar132,auVar131);
              bVar124 = (bool)((byte)uVar111 & 1);
              auVar129._0_4_ =
                   (float)((uint)bVar124 * auVar128._0_4_ | (uint)!bVar124 * auVar132._0_4_);
              bVar124 = (bool)((byte)(uVar111 >> 1) & 1);
              auVar129._4_4_ = (uint)bVar124 * auVar128._4_4_ | (uint)!bVar124 * auVar132._4_4_;
              bVar124 = (bool)((byte)(uVar111 >> 2) & 1);
              auVar129._8_4_ = (uint)bVar124 * auVar128._8_4_ | (uint)!bVar124 * auVar132._8_4_;
              bVar124 = (bool)((byte)(uVar111 >> 3) & 1);
              auVar129._12_4_ = (uint)bVar124 * auVar128._12_4_ | (uint)!bVar124 * auVar132._12_4_;
              in_ZmmResult._0_16_ = auVar129;
              auVar132 = vmovshdup_avx(auVar129);
              auVar153._4_4_ = afStack_5cc[1];
              auVar153._0_4_ = afStack_5cc[0];
              auVar153._8_8_ = 0;
              auVar131 = vdivps_avx(auVar153,auVar131);
              local_504 = afStack_5cc[2] / fVar245;
              local_590 = vmovlps_avx(auVar131);
              uVar189 = local_590;
              auVar314 = ZEXT464((uint)local_5e8._0_4_);
              local_590._4_4_ = (float)((ulong)local_590 >> 0x20);
              fVar239 = (float)local_5e8._0_4_ * (float)local_590 + auVar129._0_4_;
              fVar241 = (float)local_5e8._0_4_ * local_590._4_4_ + auVar132._0_4_;
              fVar193 = (float)((uint)bVar11 * (int)((fStack_5d0 - fVar193) / fVar245) +
                               (uint)!bVar11 * (int)(fStack_5d0 - fVar193)) +
                        (float)local_5e8._0_4_ * local_504;
              piVar1 = (int *)(puVar112 + 0x23);
              piVar2 = (int *)((long)puVar112 + 0x11c);
              piVar109 = (int *)(puVar112 + 0x24);
              lVar110 = 0;
              auVar304 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              pfVar119 = (float *)((long)&local_590 + 4);
              local_590 = uVar189;
              do {
                iVar113 = (int)lVar110;
                fVar245 = fVar239;
                if ((iVar113 != 0) && (fVar245 = fVar241, iVar113 != 1)) {
                  fVar245 = fVar193;
                }
                piVar116 = piVar1;
                if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                  piVar116 = piVar109;
                }
                piVar117 = piVar1;
                if ((iVar113 != 0) && (piVar117 = piVar2, iVar113 != 1)) {
                  piVar117 = piVar109;
                }
                auVar292._0_4_ = (float)(*piVar117 + -1);
                auVar292._4_12_ = in_ZMM10._4_12_;
                auVar131 = vminss_avx(auVar292,ZEXT416((uint)(fVar245 * (float)*piVar116)));
                uVar189 = vcmpss_avx512f(ZEXT416((uint)(fVar245 * (float)*piVar116)),
                                         ZEXT816(0) << 0x40,1);
                auVar137._16_48_ = in_ZmmResult._16_48_;
                auVar137._0_16_ = auVar131;
                fVar245 = (float)((uint)!(bool)((byte)uVar189 & 1) * auVar131._0_4_);
                in_ZmmResult._4_60_ = auVar137._4_60_;
                in_ZmmResult._0_4_ = fVar245;
                iVar114 = (int)fVar245;
                local_574[lVar110] = iVar114;
                pfVar115 = (float *)&local_590;
                if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                  pfVar115 = &local_504;
                }
                if ((*pfVar115 == 0.0) && (!NAN(*pfVar115))) {
                  pfVar115 = (float *)&local_590;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_504;
                  }
                  *pfVar115 = 0.0;
                }
                pfVar115 = (float *)&local_590;
                if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                  pfVar115 = &local_504;
                }
                if (0.0 <= *pfVar115) {
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  fVar245 = fVar239;
                  if ((iVar113 != 0) && (fVar245 = fVar241, iVar113 != 1)) {
                    fVar245 = fVar193;
                  }
                  pfVar115 = (float *)&local_590;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_504;
                  }
                  local_59c[lVar110] =
                       (float)local_5e8._0_4_ +
                       ((float)(iVar114 + 1) / (float)*piVar116 - fVar245) / *pfVar115;
                  pfVar115 = (float *)&local_590;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_504;
                  }
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  afStack_48c[lVar110] = 1.0 / ((float)*piVar116 * *pfVar115);
                  aiStack_498[lVar110] = 1;
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  iVar113 = *piVar116;
                }
                else {
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  fVar245 = fVar239;
                  if ((iVar113 != 0) && (fVar245 = fVar241, iVar113 != 1)) {
                    fVar245 = fVar193;
                  }
                  pfVar115 = (float *)&local_590;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_504;
                  }
                  local_59c[lVar110] =
                       (float)local_5e8._0_4_ +
                       ((float)iVar114 / (float)*piVar116 - fVar245) / *pfVar115;
                  pfVar115 = (float *)&local_590;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_504;
                  }
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  afStack_48c[lVar110] = -1.0 / ((float)*piVar116 * *pfVar115);
                  aiStack_498[lVar110] = -1;
                  iVar113 = -1;
                }
                aiStack_3e4[lVar110] = iVar113;
                lVar110 = lVar110 + 1;
              } while (lVar110 != 3);
              local_378._0_8_ = (long)puVar112 + 0x74U | 0x1000000000000;
              fStack_600 = 1.0;
              local_608 = (undefined1  [8])0x3f8000003f800000;
              fStack_5fc = 1.0;
              auVar299 = ZEXT464((uint)local_518._0_4_);
              do {
                auVar132 = auVar314._0_16_;
                iVar113 = *(int *)(&DAT_005841e0 +
                                  (ulong)((uint)(local_59c[1] < local_59c[2]) |
                                         (uint)(local_59c[0] < local_59c[1]) * 4 +
                                         (uint)(local_59c[0] < local_59c[2]) * 2) * 4);
                uVar273 = *(undefined4 *)
                           (puVar112[0x20] +
                           (((long)local_574[2] * (long)*(int *)((long)puVar112 + 0x11c) +
                            (long)local_574[1]) * (long)*(int *)(puVar112 + 0x23) +
                           (long)local_574[0]) * 4);
                auVar12._4_4_ = uVar273;
                auVar12._0_4_ = uVar273;
                auVar12._8_4_ = uVar273;
                auVar12._12_4_ = uVar273;
                in_ZmmResult._0_16_ = vmulps_avx512vl(auVar318._0_16_,auVar12);
                auVar131 = vminss_avx(ZEXT416((uint)local_59c[iVar113]),ZEXT416((uint)local_568));
                fVar150 = in_ZmmResult._0_4_;
                fVar193 = (float)((uint)fVar150 ^ auVar304._0_4_);
                fVar239 = (float)(in_ZmmResult._4_4_ ^ auVar304._4_4_);
                fVar241 = (float)(in_ZmmResult._8_4_ ^ auVar304._8_4_);
                fVar245 = (float)(in_ZmmResult._12_4_ ^ auVar304._12_4_);
                if ((fVar150 != 0.0) || (NAN(fVar150))) {
                  local_528._4_4_ = fVar239;
                  local_528._0_4_ = fVar193;
                  fStack_520 = fVar241;
                  fStack_51c = fVar245;
                  local_548._0_4_ = auVar131._0_4_;
                  local_5e8._0_4_ = auVar314._0_4_;
                  _local_538 = in_ZmmResult._0_16_;
                  do {
                    fVar193 = logf(1.0 - auVar299._0_4_);
                    fVar193 = (float)local_5e8._0_4_ - fVar193 / (float)local_538._0_4_;
                    uVar118 = (uint)(uVar123 >> 0x2d) ^ (uint)(uVar123 >> 0x1b);
                    bVar108 = (byte)(uVar123 >> 0x3b);
                    auVar131 = vcvtusi2ss_avx512f(in_XMM14,uVar118 >> bVar108 |
                                                           uVar118 << 0x20 - bVar108);
                    auVar131 = vminss_avx(ZEXT416((uint)(auVar131._0_4_ * 2.3283064e-10)),
                                          ZEXT416(0x3f7fffff));
                    auVar299 = ZEXT1664(auVar131);
                    if ((float)local_548._0_4_ <= fVar193) {
                      fVar193 = (float)local_548._0_4_ - (float)local_5e8._0_4_;
                      auVar157._0_4_ = fVar193 * (float)local_528._0_4_;
                      auVar157._4_4_ = fVar193 * (float)local_528._4_4_;
                      auVar157._8_4_ = fVar193 * fStack_520;
                      auVar157._12_4_ = fVar193 * fStack_51c;
                      auVar28._8_4_ = 0x3fb8aa3b;
                      auVar28._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar28._12_4_ = 0x3fb8aa3b;
                      auVar132 = vmulps_avx512vl(auVar157,auVar28);
                      auVar131 = vroundps_avx(auVar132,9);
                      auVar132 = vsubps_avx(auVar132,auVar131);
                      auVar205._0_4_ = (int)auVar131._0_4_;
                      auVar205._4_4_ = (int)auVar131._4_4_;
                      auVar205._8_4_ = (int)auVar131._8_4_;
                      auVar205._12_4_ = (int)auVar131._12_4_;
                      auVar250._8_4_ = 0x3da00ac9;
                      auVar250._0_8_ = 0x3da00ac93da00ac9;
                      auVar250._12_4_ = 0x3da00ac9;
                      auVar29._8_4_ = 0x3e679a0b;
                      auVar29._0_8_ = 0x3e679a0b3e679a0b;
                      auVar29._12_4_ = 0x3e679a0b;
                      auVar131 = vfmadd213ps_avx512vl(auVar250,auVar132,auVar29);
                      auVar30._8_4_ = 0x3f321004;
                      auVar30._0_8_ = 0x3f3210043f321004;
                      auVar30._12_4_ = 0x3f321004;
                      auVar131 = vfmadd213ps_avx512vl(auVar131,auVar132,auVar30);
                      auVar31._8_4_ = 0x3f800000;
                      auVar31._0_8_ = 0x3f8000003f800000;
                      auVar31._12_4_ = 0x3f800000;
                      auVar132 = vfmadd213ps_avx512vl(auVar131,auVar132,auVar31);
                      auVar128 = vpsrld_avx(auVar132,0x17);
                      auVar277._8_4_ = 0xffffff81;
                      auVar277._0_8_ = 0xffffff81ffffff81;
                      auVar277._12_4_ = 0xffffff81;
                      auVar131 = vpaddd_avx(auVar205,auVar277);
                      auVar131 = vpaddd_avx(auVar131,auVar128);
                      uVar111 = vpcmpgtd_avx512vl(auVar131,auVar277);
                      uVar111 = uVar111 & 0xf;
                      auVar32._8_4_ = 0x7f;
                      auVar32._0_8_ = 0x7f0000007f;
                      auVar32._12_4_ = 0x7f;
                      uVar126 = vpcmpgtd_avx512vl(auVar131,auVar32);
                      uVar126 = uVar126 & 0xf;
                      auVar33._8_4_ = 0x807fffff;
                      auVar33._0_8_ = 0x807fffff807fffff;
                      auVar33._12_4_ = 0x807fffff;
                      auVar132 = vpandd_avx512vl(auVar132,auVar33);
                      auVar131 = vpslld_avx(auVar131,0x17);
                      auVar34._8_4_ = 0x3f800000;
                      auVar34._0_8_ = 0x3f8000003f800000;
                      auVar34._12_4_ = 0x3f800000;
                      auVar131 = vpaddd_avx512vl(auVar131,auVar34);
                      auVar131 = vpord_avx512vl(auVar131,auVar132);
                      auVar132 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                      bVar124 = (bool)((byte)uVar126 & 1);
                      in_ZmmResult._0_4_ =
                           (float)((uint)bVar124 * auVar132._0_4_ |
                                  (uint)!bVar124 * (uint)((byte)uVar111 & 1) * auVar131._0_4_);
                      bVar124 = (bool)((byte)(uVar126 >> 1) & 1);
                      in_ZmmResult._4_4_ =
                           (float)((uint)bVar124 * auVar132._4_4_ |
                                  (uint)!bVar124 * (uint)((byte)(uVar111 >> 1) & 1) * auVar131._4_4_
                                  );
                      bVar124 = (bool)((byte)(uVar126 >> 2) & 1);
                      in_ZmmResult._8_4_ =
                           (float)((uint)bVar124 * auVar132._8_4_ |
                                  (uint)!bVar124 * (uint)((byte)(uVar111 >> 2) & 1) * auVar131._8_4_
                                  );
                      bVar124 = SUB81(uVar126 >> 3,0);
                      in_ZmmResult._12_4_ =
                           (float)((uint)bVar124 * auVar132._12_4_ |
                                  (uint)!bVar124 * (uint)(byte)(uVar111 >> 3) * auVar131._12_4_);
                      local_608._4_4_ = in_ZmmResult._4_4_ * (float)local_608._4_4_;
                      local_608._0_4_ = in_ZmmResult._0_4_ * (float)local_608._0_4_;
                      fStack_600 = in_ZmmResult._8_4_ * fStack_600;
                      fStack_5fc = in_ZmmResult._12_4_ * fStack_5fc;
                      cVar125 = '\n';
                    }
                    else {
                      cVar125 = '\0';
                      if (local_568 <= fVar193) {
                        local_5e8._0_4_ = fVar193;
                      }
                      else {
                        local_518._0_4_ = auVar131._0_4_;
                        fVar239 = fVar193 - (float)local_5e8._0_4_;
                        auVar156._0_4_ = fVar239 * (float)local_528._0_4_;
                        auVar156._4_4_ = fVar239 * (float)local_528._4_4_;
                        auVar156._8_4_ = fVar239 * fStack_520;
                        auVar156._12_4_ = fVar239 * fStack_51c;
                        auVar21._8_4_ = 0x3fb8aa3b;
                        auVar21._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar21._12_4_ = 0x3fb8aa3b;
                        auVar131 = vmulps_avx512vl(auVar156,auVar21);
                        _local_428 = vroundps_avx(auVar131,9);
                        auVar131 = vsubps_avx(auVar131,_local_428);
                        auVar202._8_4_ = 0x3da00ac9;
                        auVar202._0_8_ = 0x3da00ac93da00ac9;
                        auVar202._12_4_ = 0x3da00ac9;
                        auVar22._8_4_ = 0x3e679a0b;
                        auVar22._0_8_ = 0x3e679a0b3e679a0b;
                        auVar22._12_4_ = 0x3e679a0b;
                        auVar132 = vfmadd213ps_avx512vl(auVar202,auVar131,auVar22);
                        auVar23._8_4_ = 0x3f321004;
                        auVar23._0_8_ = 0x3f3210043f321004;
                        auVar23._12_4_ = 0x3f321004;
                        auVar132 = vfmadd213ps_avx512vl(auVar132,auVar131,auVar23);
                        auVar24._8_4_ = 0x3f800000;
                        auVar24._0_8_ = 0x3f8000003f800000;
                        auVar24._12_4_ = 0x3f800000;
                        local_418 = vfmadd213ps_avx512vl(auVar132,auVar131,auVar24);
                        local_348 = ZEXT416((uint)fVar193);
                        auVar203._0_4_ = fVar193 * afStack_5cc[0] + (float)local_5d8._0_4_;
                        auVar203._4_4_ = fVar193 * afStack_5cc[1] + (float)local_5d8._4_4_;
                        auVar203._8_4_ = fVar193 * 0.0 + 0.0;
                        auVar203._12_4_ = fVar193 * 0.0 + 0.0;
                        uVar242 = auVar203._8_8_;
                        local_580.super_Tuple3<pbrt::Point3,_float>.z =
                             fVar193 * afStack_5cc[2] + fStack_5d0;
                        uVar190 = 0;
                        uVar189 = vmovlps_avx(auVar203);
                        local_580.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar189;
                        local_580.super_Tuple3<pbrt::Point3,_float>.y =
                             (float)((ulong)uVar189 >> 0x20);
                        SVar325 = UniformGridMediumProvider::Density
                                            ((UniformGridMediumProvider *)*puVar112,&local_580,
                                             lambda);
                        local_4d8._8_8_ = uVar190;
                        local_4d8._0_8_ = SVar325.values.values._0_8_;
                        local_4f8._8_8_ = uVar242;
                        local_4f8._0_8_ = SVar325.values.values._8_8_;
                        p.super_Tuple3<pbrt::Point3,_float>.y =
                             local_580.super_Tuple3<pbrt::Point3,_float>.y;
                        p.super_Tuple3<pbrt::Point3,_float>.x =
                             local_580.super_Tuple3<pbrt::Point3,_float>.x;
                        p.super_Tuple3<pbrt::Point3,_float>.z =
                             local_580.super_Tuple3<pbrt::Point3,_float>.z;
                        auVar191 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                        auVar243 = ZEXT856(0);
                        SVar325 = UniformGridMediumProvider::Le
                                            ((UniformGridMediumProvider *)*puVar112,p,lambda);
                        auVar230._0_8_ = SVar325.values.values._8_8_;
                        auVar230._8_56_ = auVar191;
                        auVar182._0_8_ = SVar325.values.values._0_8_;
                        auVar182._8_56_ = auVar243;
                        auVar131 = vfmadd231ss_fma(ZEXT416((uint)(local_580.
                                                                  super_Tuple3<pbrt::Point3,_float>.
                                                                  y * *(float *)((long)puVar112 +
                                                                                0x7c))),
                                                   ZEXT416((uint)local_580.
                                                                 super_Tuple3<pbrt::Point3,_float>.x
                                                          ),ZEXT416(*(uint *)(puVar112 + 0xf)));
                        auVar131 = vfmadd231ss_fma(auVar131,ZEXT416((uint)local_580.
                                                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar112 + 0x10)));
                        fVar193 = auVar131._0_4_ + *(float *)((long)puVar112 + 0x84);
                        auVar131 = vfmadd231ss_fma(ZEXT416((uint)(local_580.
                                                                  super_Tuple3<pbrt::Point3,_float>.
                                                                  y * *(float *)((long)puVar112 +
                                                                                0x8c))),
                                                   ZEXT416((uint)local_580.
                                                                 super_Tuple3<pbrt::Point3,_float>.x
                                                          ),ZEXT416(*(uint *)(puVar112 + 0x11)));
                        auVar131 = vfmadd231ss_fma(auVar131,ZEXT416((uint)local_580.
                                                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar112 + 0x12)));
                        fVar239 = auVar131._0_4_ + *(float *)((long)puVar112 + 0x94);
                        auVar131 = vfmadd231ss_fma(ZEXT416((uint)(local_580.
                                                                  super_Tuple3<pbrt::Point3,_float>.
                                                                  y * *(float *)((long)puVar112 +
                                                                                0x9c))),
                                                   ZEXT416((uint)local_580.
                                                                 super_Tuple3<pbrt::Point3,_float>.x
                                                          ),ZEXT416(*(uint *)(puVar112 + 0x13)));
                        auVar131 = vfmadd231ss_fma(auVar131,ZEXT416((uint)local_580.
                                                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar112 + 0x14)));
                        auVar132 = vfmadd231ss_fma(ZEXT416((uint)(local_580.
                                                                  super_Tuple3<pbrt::Point3,_float>.
                                                                  y * *(float *)((long)puVar112 +
                                                                                0xac))),
                                                   ZEXT416((uint)local_580.
                                                                 super_Tuple3<pbrt::Point3,_float>.x
                                                          ),ZEXT416(*(uint *)(puVar112 + 0x15)));
                        auVar132 = vfmadd231ss_fma(auVar132,ZEXT416((uint)local_580.
                                                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar112 + 0x16)));
                        fVar241 = auVar132._0_4_ + *(float *)((long)puVar112 + 0xb4);
                        bVar124 = fVar241 == 1.0;
                        fVar245 = auVar131._0_4_ + *(float *)((long)puVar112 + 0xa4);
                        auVar204._0_4_ = local_4c0._16_4_ * local_4c0._16_4_;
                        auVar204._4_4_ = local_4c0._20_4_ * local_4c0._20_4_;
                        auVar204._8_8_ = 0;
                        auVar131 = vmovshdup_avx(auVar204);
                        fVar150 = (float)local_4c0._12_4_ * (float)local_4c0._12_4_ + auVar204._0_4_
                                  + auVar131._0_4_;
                        if (fVar150 < 0.0) {
                          local_3a8 = ZEXT416((uint)fVar193);
                          local_3d8 = ZEXT416((uint)fVar239);
                          local_2f8 = ZEXT416((uint)fVar245);
                          local_308._0_4_ = fVar241;
                          local_398 = auVar230._0_16_;
                          local_388 = auVar182._0_16_;
                          fVar150 = sqrtf(fVar150);
                          fVar241 = (float)local_308._0_4_;
                          auVar131 = local_388;
                          auVar132 = local_398;
                          auVar128 = local_3a8;
                          auVar130 = local_2f8;
                          fVar239 = (float)local_3d8._0_4_;
                        }
                        else {
                          auVar131 = vsqrtss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                          fVar150 = auVar131._0_4_;
                          auVar131 = auVar182._0_16_;
                          auVar132 = auVar230._0_16_;
                          auVar128 = ZEXT416((uint)fVar193);
                          auVar130 = ZEXT416((uint)fVar245);
                        }
                        auVar256 = _local_538;
                        auVar206._0_4_ = (int)(float)local_428._0_4_;
                        auVar206._4_4_ = (int)(float)local_428._4_4_;
                        auVar206._8_4_ = (int)fStack_420;
                        auVar206._12_4_ = (int)fStack_41c;
                        auVar251 = vpsrld_avx(local_418,0x17);
                        auVar278._8_4_ = 0xffffff81;
                        auVar278._0_8_ = 0xffffff81ffffff81;
                        auVar278._12_4_ = 0xffffff81;
                        auVar155 = vpaddd_avx(auVar206,auVar278);
                        auVar155 = vpaddd_avx(auVar155,auVar251);
                        uVar111 = vpcmpgtd_avx512vl(auVar155,auVar278);
                        uVar111 = uVar111 & 0xf;
                        auVar25._8_4_ = 0x7f;
                        auVar25._0_8_ = 0x7f0000007f;
                        auVar25._12_4_ = 0x7f;
                        uVar126 = vpcmpgtd_avx512vl(auVar155,auVar25);
                        uVar126 = uVar126 & 0xf;
                        auVar26._8_4_ = 0x807fffff;
                        auVar26._0_8_ = 0x807fffff807fffff;
                        auVar26._12_4_ = 0x807fffff;
                        auVar251 = vpandd_avx512vl(local_418,auVar26);
                        auVar155 = vpslld_avx(auVar155,0x17);
                        auVar27._8_4_ = 0x3f800000;
                        auVar27._0_8_ = 0x3f8000003f800000;
                        auVar27._12_4_ = 0x3f800000;
                        auVar155 = vpaddd_avx512vl(auVar155,auVar27);
                        auVar133 = vpord_avx512vl(auVar155,auVar251);
                        auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        bVar11 = (bool)((byte)uVar126 & 1);
                        bVar8 = (bool)((byte)(uVar126 >> 1) & 1);
                        bVar9 = (bool)((byte)(uVar126 >> 2) & 1);
                        bVar10 = SUB81(uVar126 >> 3,0);
                        auVar155 = vmovlhps_avx(local_4d8,local_4f8);
                        auVar279._0_4_ = auVar155._0_4_ * local_358;
                        auVar279._4_4_ = auVar155._4_4_ * fStack_354;
                        auVar279._8_4_ = auVar155._8_4_ * fStack_350;
                        auVar279._12_4_ = auVar155._12_4_ * fStack_34c;
                        auVar251 = vshufpd_avx(auVar279,auVar279,1);
                        auVar252._0_4_ = auVar155._0_4_ * local_368;
                        auVar252._4_4_ = auVar155._4_4_ * fStack_364;
                        auVar252._8_4_ = auVar155._8_4_ * fStack_360;
                        auVar252._12_4_ = auVar155._12_4_ * fStack_35c;
                        auVar155 = vshufpd_avx(auVar252,auVar252,1);
                        aStack_2b8.mi.sigma_maj.values.values[2] =
                             (float)((uint)bVar11 * auVar134._0_4_ |
                                    (uint)!bVar11 * (uint)((byte)uVar111 & 1) * auVar133._0_4_) *
                             (float)local_608._0_4_;
                        aStack_2b8.mi.sigma_maj.values.values[3] =
                             (float)((uint)bVar8 * auVar134._4_4_ |
                                    (uint)!bVar8 * (uint)((byte)(uVar111 >> 1) & 1) * auVar133._4_4_
                                    ) * (float)local_608._4_4_;
                        aStack_2b8.mi.Le.values.values[0] =
                             (float)((uint)bVar9 * auVar134._8_4_ |
                                    (uint)!bVar9 * (uint)((byte)(uVar111 >> 2) & 1) * auVar133._8_4_
                                    ) * fStack_600;
                        aStack_2b8.mi.Le.values.values[1] =
                             (float)((uint)bVar10 * auVar134._12_4_ |
                                    (uint)!bVar10 * (uint)(byte)(uVar111 >> 3) * auVar133._12_4_) *
                             fStack_5fc;
                        fVar193 = auVar128._0_4_ / fVar241;
                        auVar139._4_12_ = auVar128._4_12_;
                        auVar139._0_4_ = fVar193;
                        fVar245 = auVar130._0_4_ / fVar241;
                        auVar140._4_12_ = auVar130._4_12_;
                        auVar140._0_4_ = fVar245;
                        auVar139._16_48_ = in_ZmmResult._16_48_;
                        auVar138._4_60_ = auVar139._4_60_;
                        auVar138._0_4_ =
                             (uint)bVar124 * (int)auVar128._0_4_ + (uint)!bVar124 * (int)fVar193;
                        iVar114 = (uint)bVar124 * (int)fVar239 +
                                  (uint)!bVar124 * (int)(fVar239 / fVar241);
                        auVar140._16_48_ = in_ZmmResult._16_48_;
                        in_ZmmResult._4_60_ = auVar140._4_60_;
                        in_ZmmResult._0_4_ =
                             (float)((uint)bVar124 * (int)auVar130._0_4_ +
                                    (uint)!bVar124 * (int)fVar245);
                        auVar315._0_8_ = local_4c0._12_8_ ^ 0x8000000080000000;
                        auVar315._8_4_ = 0x80000000;
                        auVar315._12_4_ = 0x80000000;
                        auVar319._4_4_ = fVar150;
                        auVar319._0_4_ = fVar150;
                        auVar319._8_4_ = fVar150;
                        auVar319._12_4_ = fVar150;
                        auVar128 = vdivps_avx(auVar315,auVar319);
                        auVar320._0_4_ = -fStack_4ac;
                        auVar320._4_4_ = 0x80000000;
                        auVar320._8_4_ = 0x80000000;
                        auVar320._12_4_ = 0x80000000;
                        auVar158._0_4_ = auVar320._0_4_ / fVar150;
                        auVar158._4_12_ = auVar320._4_12_;
                        aStack_2b8._96_8_ = local_538;
                        aStack_2b8.mi.sigma_s.values.values[0] = (float)uStack_530;
                        aStack_2b8.mi.sigma_s.values.values[1] = uStack_530._4_4_;
                        auVar305._4_4_ = iVar114;
                        auVar305._0_4_ = iVar114;
                        auVar305._8_4_ = iVar114;
                        auVar305._12_4_ = iVar114;
                        auVar310._4_4_ = in_ZmmResult._0_4_;
                        auVar310._0_4_ = in_ZmmResult._0_4_;
                        auVar310._8_4_ = in_ZmmResult._0_4_;
                        auVar310._12_4_ = in_ZmmResult._0_4_;
                        aStack_2b8._16_16_ = ZEXT816(0);
                        aStack_2b8.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y =
                             0.0;
                        auVar130 = vshufps_avx(auVar138._0_16_,auVar305,0x40);
                        local_2d0._0_4_ = auVar130._0_4_;
                        local_2d0._4_4_ = auVar130._4_4_;
                        local_2d0._8_4_ = auVar130._8_4_;
                        local_2d0._12_4_ = auVar130._12_4_;
                        uVar189 = vmovlps_avx(auVar310);
                        local_2d0._16_4_ = (undefined4)uVar189;
                        local_2d0._20_4_ = (undefined4)((ulong)uVar189 >> 0x20);
                        aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = FStack_4a8;
                        uVar189 = vmovlps_avx(auVar128);
                        aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar189;
                        aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
                             (Float)((ulong)uVar189 >> 0x20);
                        aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0
                        ;
                        aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0
                        ;
                        aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                             SUB84(local_588,0);
                        aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                             (float)((ulong)local_588 >> 0x20);
                        aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                             local_378._0_4_;
                        aStack_2b8._60_4_ = local_378._4_4_;
                        auVar176._16_16_ = auVar155;
                        auVar176._0_16_ = auVar158;
                        auVar296._16_16_ = auVar251;
                        auVar296._0_16_ = auVar158;
                        auVar178 = vperm2f128_avx(auVar296,auVar176,0x31);
                        auVar266._16_16_ = auVar252;
                        auVar266._0_16_ = auVar279;
                        auVar178 = vunpcklpd_avx(auVar266,auVar178);
                        aStack_2b8._64_4_ = auVar178._0_4_;
                        aStack_2b8._68_4_ = auVar178._4_4_;
                        aStack_2b8.ei.super_Interaction.medium.
                        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                        .bits = auVar178._8_8_;
                        aStack_2b8.si.dpdu.super_Tuple3<pbrt::Vector3,_float> = auVar178._16_12_;
                        aStack_2b8.mi.sigma_a.values.values[1] = auVar178._28_4_;
                        auVar132 = vmovlhps_avx(auVar131,auVar132);
                        aStack_2b8._112_8_ = auVar132._0_8_;
                        aStack_2b8._120_8_ = auVar132._8_8_;
                        in_ZMM10 = ZEXT464((uint)FStack_4a8);
                        in_ZMM12 = ZEXT1664(auVar131);
                        _local_538 = auVar256;
                        aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = auVar158._0_4_;
                        bVar124 = RandomWalk::anon_class_88_11_14aa307c::operator()
                                            (&local_480,(MediumSample *)local_2d0);
                        cVar125 = !bVar124;
                        if ((bool)cVar125) {
                          local_168._8_4_ = 0x3f800000;
                          local_168._0_8_ = 0x3f8000003f800000;
                          local_168._12_4_ = 0x3f800000;
                        }
                        else {
                          local_5e8._0_4_ = local_348._0_4_;
                        }
                        fStack_600 = 1.0;
                        local_608 = (undefined1  [8])0x3f8000003f800000;
                        fStack_5fc = 1.0;
                        auVar299 = ZEXT464((uint)local_518._0_4_);
                        lambda = local_330;
                      }
                    }
                    uVar123 = uVar123 * 0x5851f42d4c957f2d + (long)local_3c8;
                  } while (cVar125 == '\0');
                  if (cVar125 == '\n') {
                    auVar304 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)
                                                 ));
                    auVar132 = ZEXT416((uint)local_5e8._0_4_);
                    auVar318 = ZEXT1664(local_318);
                    auVar131 = ZEXT416((uint)local_548._0_4_);
                    goto LAB_0040505f;
                  }
                  auVar132 = ZEXT416((uint)local_5e8._0_4_);
                  auVar304 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)))
                  ;
                  auVar318 = ZEXT1664(local_318);
                }
                else {
                  fVar150 = auVar131._0_4_ - auVar314._0_4_;
                  auVar154._0_4_ = fVar150 * fVar193;
                  auVar154._4_4_ = fVar150 * fVar239;
                  auVar154._8_4_ = fVar150 * fVar241;
                  auVar154._12_4_ = fVar150 * fVar245;
                  auVar13._8_4_ = 0x3fb8aa3b;
                  auVar13._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar13._12_4_ = 0x3fb8aa3b;
                  auVar130 = vmulps_avx512vl(auVar154,auVar13);
                  auVar128 = vroundps_avx(auVar130,9);
                  auVar130 = vsubps_avx(auVar130,auVar128);
                  auVar201._0_4_ = (int)auVar128._0_4_;
                  auVar201._4_4_ = (int)auVar128._4_4_;
                  auVar201._8_4_ = (int)auVar128._8_4_;
                  auVar201._12_4_ = (int)auVar128._12_4_;
                  auVar249._8_4_ = 0x3da00ac9;
                  auVar249._0_8_ = 0x3da00ac93da00ac9;
                  auVar249._12_4_ = 0x3da00ac9;
                  auVar14._8_4_ = 0x3e679a0b;
                  auVar14._0_8_ = 0x3e679a0b3e679a0b;
                  auVar14._12_4_ = 0x3e679a0b;
                  auVar128 = vfmadd213ps_avx512vl(auVar249,auVar130,auVar14);
                  auVar15._8_4_ = 0x3f321004;
                  auVar15._0_8_ = 0x3f3210043f321004;
                  auVar15._12_4_ = 0x3f321004;
                  auVar128 = vfmadd213ps_avx512vl(auVar128,auVar130,auVar15);
                  auVar16._8_4_ = 0x3f800000;
                  auVar16._0_8_ = 0x3f8000003f800000;
                  auVar16._12_4_ = 0x3f800000;
                  auVar130 = vfmadd213ps_avx512vl(auVar128,auVar130,auVar16);
                  auVar155 = vpsrld_avx(auVar130,0x17);
                  auVar276._8_4_ = 0xffffff81;
                  auVar276._0_8_ = 0xffffff81ffffff81;
                  auVar276._12_4_ = 0xffffff81;
                  auVar128 = vpaddd_avx(auVar201,auVar276);
                  auVar128 = vpaddd_avx(auVar128,auVar155);
                  uVar111 = vpcmpgtd_avx512vl(auVar128,auVar276);
                  uVar111 = uVar111 & 0xf;
                  auVar17._8_4_ = 0x7f;
                  auVar17._0_8_ = 0x7f0000007f;
                  auVar17._12_4_ = 0x7f;
                  uVar126 = vpcmpgtd_avx512vl(auVar128,auVar17);
                  uVar126 = uVar126 & 0xf;
                  auVar18._8_4_ = 0x807fffff;
                  auVar18._0_8_ = 0x807fffff807fffff;
                  auVar18._12_4_ = 0x807fffff;
                  auVar130 = vpandd_avx512vl(auVar130,auVar18);
                  auVar128 = vpslld_avx(auVar128,0x17);
                  auVar19._8_4_ = 0x3f800000;
                  auVar19._0_8_ = 0x3f8000003f800000;
                  auVar19._12_4_ = 0x3f800000;
                  auVar128 = vpaddd_avx512vl(auVar128,auVar19);
                  auVar128 = vpord_avx512vl(auVar128,auVar130);
                  auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar124 = (bool)((byte)uVar126 & 1);
                  in_ZmmResult._0_4_ =
                       (float)((uint)bVar124 * auVar130._0_4_ |
                              (uint)!bVar124 * (uint)((byte)uVar111 & 1) * auVar128._0_4_);
                  bVar124 = (bool)((byte)(uVar126 >> 1) & 1);
                  in_ZmmResult._4_4_ =
                       (float)((uint)bVar124 * auVar130._4_4_ |
                              (uint)!bVar124 * (uint)((byte)(uVar111 >> 1) & 1) * auVar128._4_4_);
                  bVar124 = (bool)((byte)(uVar126 >> 2) & 1);
                  in_ZmmResult._8_4_ =
                       (float)((uint)bVar124 * auVar130._8_4_ |
                              (uint)!bVar124 * (uint)((byte)(uVar111 >> 2) & 1) * auVar128._8_4_);
                  bVar124 = SUB81(uVar126 >> 3,0);
                  in_ZmmResult._12_4_ =
                       (float)((uint)bVar124 * auVar130._12_4_ |
                              (uint)!bVar124 * (uint)(byte)(uVar111 >> 3) * auVar128._12_4_);
                  local_608._4_4_ = in_ZmmResult._4_4_ * (float)local_608._4_4_;
                  local_608._0_4_ = in_ZmmResult._0_4_ * (float)local_608._0_4_;
                  fStack_600 = in_ZmmResult._8_4_ * fStack_600;
                  fStack_5fc = in_ZmmResult._12_4_ * fStack_5fc;
LAB_0040505f:
                  cVar125 = '\b';
                  if ((local_59c[iVar113] <= local_568) &&
                     (iVar114 = local_574[iVar113],
                     local_574[iVar113] = iVar114 + aiStack_498[iVar113],
                     iVar114 + aiStack_498[iVar113] != aiStack_3e4[iVar113])) {
                    local_59c[iVar113] = local_59c[iVar113] + afStack_48c[iVar113];
                    cVar125 = '\0';
                    auVar132 = auVar131;
                  }
                }
                auVar131 = auVar304._0_16_;
                auVar314 = ZEXT1664(auVar132);
              } while (cVar125 == '\0');
              this_00 = local_408;
              ray = local_400;
              sampler = local_3f8;
              auVar134 = local_168;
              if (cVar125 == '\b') {
                auVar134 = _local_608;
              }
            }
            auVar132 = vshufpd_avx(auVar134,auVar134,1);
            local_168 = auVar134;
          }
          else {
            local_418._0_4_ = fVar193;
            local_480.terminated = &local_611;
            local_480.beta = &local_4e8;
            local_480.vertex = local_550;
            local_480.pdfFwd = &local_5ec;
            local_480.prev = local_500;
            local_480.bounces = &local_60c;
            local_480.maxDepth = &maxDepth;
            local_480.anyNonSpecularBounces = &local_612;
            local_480.scattered = &local_613;
            auVar274._0_4_ = (float)(undefined4)uVar111 * (float)(undefined4)uVar111;
            auVar274._4_4_ = (float)uVar111._4_4_ * (float)uVar111._4_4_;
            auVar274._8_8_ = 0;
            fVar193 = (float)uVar126;
            auVar131 = vhaddps_avx(auVar274,auVar274);
            fVar193 = fVar193 * fVar193 + auVar131._0_4_;
            _local_528 = auVar132;
            local_4d8 = auVar130;
            _local_428 = auVar128;
            if (fVar193 < 0.0) {
              local_5e8._0_4_ = fVar193;
              fVar239 = sqrtf(fVar193);
              fVar193 = (float)local_5e8._0_4_;
            }
            else {
              auVar131 = vsqrtss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193));
              fVar239 = auVar131._0_4_;
            }
            auVar243 = (undefined1  [56])0x0;
            local_3c8._0_4_ = fVar239;
            if (fVar193 < 0.0) {
              auVar243 = (undefined1  [56])0x0;
              auVar179._0_4_ = sqrtf(fVar193);
              auVar179._4_60_ = extraout_var_00;
              local_4f8 = auVar179._0_16_;
            }
            else {
              local_4f8 = vsqrtss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193));
            }
            this_01 = (DenselySampledSpectrum *)((ulong)local_588 & 0xffffffffffff);
            uVar189 = 0;
            _local_5e8 = ZEXT416((uint)this_01[3].lambda_min);
            SVar325 = DenselySampledSpectrum::Sample(this_01,lambda);
            auVar226._0_8_ = SVar325.values.values._8_8_;
            auVar226._8_56_ = auVar243;
            local_568 = SVar325.values.values[0];
            fStack_564 = SVar325.values.values[1];
            fStack_560 = (float)uVar189;
            fStack_55c = (float)((ulong)uVar189 >> 0x20);
            _local_538 = auVar226._0_16_;
            auVar191 = (undefined1  [56])0x0;
            _local_548 = ZEXT416((uint)this_01[3].lambda_min);
            SVar325 = DenselySampledSpectrum::Sample(this_01 + 1,lambda);
            auVar227._0_8_ = SVar325.values.values._8_8_;
            auVar227._8_56_ = auVar243;
            auVar180._0_8_ = SVar325.values.values._0_8_;
            auVar180._8_56_ = auVar191;
            auVar102._4_4_ = fStack_564;
            auVar102._0_4_ = local_568;
            auVar102._8_4_ = fStack_560;
            auVar102._12_4_ = fStack_55c;
            auVar131 = vunpcklpd_avx(auVar102,_local_538);
            fVar246 = (float)local_5e8._0_4_ * auVar131._0_4_;
            fVar270 = (float)local_5e8._0_4_ * auVar131._4_4_;
            fVar271 = (float)local_5e8._0_4_ * auVar131._8_4_;
            fVar272 = (float)local_5e8._0_4_ * auVar131._12_4_;
            auVar131 = vmovlhps_avx(auVar180._0_16_,auVar227._0_16_);
            fVar239 = (float)local_548._0_4_ * auVar131._0_4_;
            fVar241 = (float)local_548._0_4_ * auVar131._4_4_;
            fVar245 = (float)local_548._0_4_ * auVar131._8_4_;
            fVar150 = (float)local_548._0_4_ * auVar131._12_4_;
            fVar192 = fVar239 + fVar246;
            fVar238 = fVar241 + fVar270;
            fVar240 = fVar245 + fVar271;
            fVar244 = fVar150 + fVar272;
            bVar124 = ABS((float)local_3c8._0_4_ * (float)local_608._0_4_) == INFINITY;
            fVar193 = (float)((uint)bVar124 * 0x7f7fffff +
                             (uint)!bVar124 * (int)((float)local_3c8._0_4_ * (float)local_608._0_4_)
                             );
            if ((fVar192 != 0.0) || (NAN(fVar192))) {
              local_5e8._4_4_ = fVar270;
              local_5e8._0_4_ = fVar246;
              fStack_5e0 = fVar271;
              fStack_5dc = fVar272;
              _local_3c8 = ZEXT1632(CONCAT412(fVar244,CONCAT48(fVar240,CONCAT44(fVar238,fVar192))));
              _local_608 = ZEXT416((uint)fVar193);
              in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
              in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
              local_568 = fVar239;
              fStack_564 = fVar241;
              fStack_560 = fVar245;
              fStack_55c = fVar150;
              fVar193 = logf(1.0 - (float)local_518._0_4_);
              auVar131._8_4_ = 0x80000000;
              auVar131._0_8_ = 0x8000000080000000;
              auVar131._12_4_ = 0x80000000;
              fVar193 = -fVar193 / (float)local_3c8._0_4_;
              if ((float)local_608._0_4_ <= fVar193) {
                auVar173._0_4_ = (float)local_3c8._0_4_ * -(float)local_608._0_4_;
                auVar173._4_4_ = (float)local_3c8._4_4_ * -(float)local_608._0_4_;
                auVar173._8_4_ = fStack_3c0 * -(float)local_608._0_4_;
                auVar173._12_4_ = fStack_3bc * -(float)local_608._0_4_;
                auVar49._8_4_ = 0x3fb8aa3b;
                auVar49._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar49._12_4_ = 0x3fb8aa3b;
                auVar128 = vmulps_avx512vl(auVar173,auVar49);
                auVar132 = vroundps_avx(auVar128,9);
                auVar128 = vsubps_avx(auVar128,auVar132);
                auVar223._0_4_ = (int)auVar132._0_4_;
                auVar223._4_4_ = (int)auVar132._4_4_;
                auVar223._8_4_ = (int)auVar132._8_4_;
                auVar223._12_4_ = (int)auVar132._12_4_;
                auVar261._8_4_ = 0x3da00ac9;
                auVar261._0_8_ = 0x3da00ac93da00ac9;
                auVar261._12_4_ = 0x3da00ac9;
                auVar50._8_4_ = 0x3e679a0b;
                auVar50._0_8_ = 0x3e679a0b3e679a0b;
                auVar50._12_4_ = 0x3e679a0b;
                auVar132 = vfmadd213ps_avx512vl(auVar261,auVar128,auVar50);
                auVar51._8_4_ = 0x3f321004;
                auVar51._0_8_ = 0x3f3210043f321004;
                auVar51._12_4_ = 0x3f321004;
                auVar132 = vfmadd213ps_avx512vl(auVar132,auVar128,auVar51);
                auVar52._8_4_ = 0x3f800000;
                auVar52._0_8_ = 0x3f8000003f800000;
                auVar52._12_4_ = 0x3f800000;
                auVar128 = vfmadd213ps_avx512vl(auVar132,auVar128,auVar52);
                auVar130 = vpsrld_avx(auVar128,0x17);
                auVar290._8_4_ = 0xffffff81;
                auVar290._0_8_ = 0xffffff81ffffff81;
                auVar290._12_4_ = 0xffffff81;
                auVar132 = vpaddd_avx(auVar223,auVar290);
                auVar132 = vpaddd_avx(auVar132,auVar130);
                uVar123 = vpcmpgtd_avx512vl(auVar132,auVar290);
                uVar123 = uVar123 & 0xf;
                auVar53._8_4_ = 0x7f;
                auVar53._0_8_ = 0x7f0000007f;
                auVar53._12_4_ = 0x7f;
                uVar111 = vpcmpgtd_avx512vl(auVar132,auVar53);
                uVar111 = uVar111 & 0xf;
                auVar54._8_4_ = 0x807fffff;
                auVar54._0_8_ = 0x807fffff807fffff;
                auVar54._12_4_ = 0x807fffff;
                auVar128 = vpandd_avx512vl(auVar128,auVar54);
                auVar132 = vpslld_avx(auVar132,0x17);
                auVar55._8_4_ = 0x3f800000;
                auVar55._0_8_ = 0x3f8000003f800000;
                auVar55._12_4_ = 0x3f800000;
                auVar132 = vpaddd_avx512vl(auVar132,auVar55);
                auVar132 = vpord_avx512vl(auVar132,auVar128);
                auVar128 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                bVar124 = (bool)((byte)uVar111 & 1);
                auVar134._0_4_ =
                     (uint)bVar124 * auVar128._0_4_ |
                     (uint)!bVar124 * (uint)((byte)uVar123 & 1) * auVar132._0_4_;
                bVar124 = (bool)((byte)(uVar111 >> 1) & 1);
                auVar134._4_4_ =
                     (uint)bVar124 * auVar128._4_4_ |
                     (uint)!bVar124 * (uint)((byte)(uVar123 >> 1) & 1) * auVar132._4_4_;
                bVar124 = (bool)((byte)(uVar111 >> 2) & 1);
                auVar134._8_4_ =
                     (uint)bVar124 * auVar128._8_4_ |
                     (uint)!bVar124 * (uint)((byte)(uVar123 >> 2) & 1) * auVar132._8_4_;
                bVar124 = SUB81(uVar111 >> 3,0);
                auVar134._12_4_ =
                     (uint)bVar124 * auVar128._12_4_ |
                     (uint)!bVar124 * (uint)(byte)(uVar123 >> 3) * auVar132._12_4_;
                in_ZmmResult._0_16_ = auVar134;
              }
              else {
                local_608 = (undefined1  [8])
                            (CONCAT44(extraout_var._0_4_,fVar193) ^ 0x8000000000000000);
                fStack_600 = (float)(extraout_var._4_4_ ^ 0x80000000);
                fStack_5fc = (float)(extraout_var._8_4_ ^ 0x80000000);
                auVar171._0_4_ = (float)local_3c8._0_4_ * -fVar193;
                auVar171._4_4_ = (float)local_3c8._4_4_ * -fVar193;
                auVar171._8_4_ = fStack_3c0 * -fVar193;
                auVar171._12_4_ = fStack_3bc * -fVar193;
                auVar42._8_4_ = 0x3fb8aa3b;
                auVar42._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar42._12_4_ = 0x3fb8aa3b;
                auVar131 = vmulps_avx512vl(auVar171,auVar42);
                _local_548 = vroundps_avx(auVar131,9);
                auVar131 = vsubps_avx(auVar131,_local_548);
                auVar221._8_4_ = 0x3da00ac9;
                auVar221._0_8_ = 0x3da00ac93da00ac9;
                auVar221._12_4_ = 0x3da00ac9;
                auVar43._8_4_ = 0x3e679a0b;
                auVar43._0_8_ = 0x3e679a0b3e679a0b;
                auVar43._12_4_ = 0x3e679a0b;
                auVar132 = vfmadd213ps_avx512vl(auVar221,auVar131,auVar43);
                auVar44._8_4_ = 0x3f321004;
                auVar44._0_8_ = 0x3f3210043f321004;
                auVar44._12_4_ = 0x3f321004;
                auVar132 = vfmadd213ps_avx512vl(auVar132,auVar131,auVar44);
                auVar45._8_4_ = 0x3f800000;
                auVar45._0_8_ = 0x3f8000003f800000;
                auVar45._12_4_ = 0x3f800000;
                _local_538 = vfmadd213ps_avx512vl(auVar132,auVar131,auVar45);
                local_518 = ZEXT416((uint)this_01[3].lambda_max);
                auVar243 = ZEXT856(0);
                auVar191 = ZEXT856(local_538._8_8_);
                SVar325 = DenselySampledSpectrum::Sample(this_01 + 2,lambda);
                auVar237._0_8_ = SVar325.values.values._8_8_;
                auVar237._8_56_ = auVar191;
                auVar187._0_8_ = SVar325.values.values._0_8_;
                auVar187._8_56_ = auVar243;
                auVar130 = vshufpd_avx(_local_5e8,_local_5e8,1);
                auVar288._4_4_ = local_4f8._0_4_;
                auVar288._0_4_ = local_4f8._0_4_;
                auVar288._8_4_ = local_4f8._0_4_;
                auVar288._12_4_ = local_4f8._0_4_;
                auVar131 = vdivps_avx(local_4d8,auVar288);
                fVar245 = local_528._0_4_ / (float)local_4f8._0_4_;
                auVar251 = local_3c8._0_16_;
                auVar155 = vshufpd_avx(auVar251,auVar251,1);
                auVar303._0_4_ = (int)(float)local_548._0_4_;
                auVar303._4_4_ = (int)(float)local_548._4_4_;
                auVar303._8_4_ = (int)fStack_540;
                auVar303._12_4_ = (int)fStack_53c;
                auVar128 = vpsrld_avx(_local_538,0x17);
                auVar313._8_4_ = 0xffffff81;
                auVar313._0_8_ = 0xffffff81ffffff81;
                auVar313._12_4_ = 0xffffff81;
                auVar132 = vpaddd_avx(auVar313,auVar303);
                auVar132 = vpaddd_avx(auVar132,auVar128);
                uVar123 = vpcmpgtd_avx512vl(auVar132,auVar313);
                uVar123 = uVar123 & 0xf;
                auVar46._8_4_ = 0x7f;
                auVar46._0_8_ = 0x7f0000007f;
                auVar46._12_4_ = 0x7f;
                uVar111 = vpcmpgtd_avx512vl(auVar132,auVar46);
                uVar111 = uVar111 & 0xf;
                auVar47._8_4_ = 0x807fffff;
                auVar47._0_8_ = 0x807fffff807fffff;
                auVar47._12_4_ = 0x807fffff;
                auVar128 = vpandd_avx512vl(_local_538,auVar47);
                auVar132 = vpslld_avx(auVar132,0x17);
                auVar48._8_4_ = 0x3f800000;
                auVar48._0_8_ = 0x3f8000003f800000;
                auVar48._12_4_ = 0x3f800000;
                auVar132 = vpaddd_avx512vl(auVar132,auVar48);
                auVar132 = vpord_avx512vl(auVar132,auVar128);
                auVar128 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                bVar124 = (bool)((byte)uVar111 & 1);
                in_ZmmResult._0_4_ =
                     (float)((uint)bVar124 * auVar128._0_4_ |
                            (uint)!bVar124 * (uint)((byte)uVar123 & 1) * auVar132._0_4_);
                bVar124 = (bool)((byte)(uVar111 >> 1) & 1);
                in_ZmmResult._4_4_ =
                     (float)((uint)bVar124 * auVar128._4_4_ |
                            (uint)!bVar124 * (uint)((byte)(uVar123 >> 1) & 1) * auVar132._4_4_);
                bVar124 = (bool)((byte)(uVar111 >> 2) & 1);
                in_ZmmResult._8_4_ =
                     (float)((uint)bVar124 * auVar128._8_4_ |
                            (uint)!bVar124 * (uint)((byte)(uVar123 >> 2) & 1) * auVar132._8_4_);
                bVar124 = SUB81(uVar111 >> 3,0);
                in_ZmmResult._12_4_ =
                     (float)((uint)bVar124 * auVar128._12_4_ |
                            (uint)!bVar124 * (uint)(byte)(uVar123 >> 3) * auVar132._12_4_);
                auVar132 = vmovlhps_avx(auVar187._0_16_,auVar237._0_16_);
                auVar172._0_4_ = (float)local_518._0_4_ * auVar132._0_4_;
                auVar172._4_4_ = (float)local_518._0_4_ * auVar132._4_4_;
                auVar172._8_4_ = (float)local_518._0_4_ * auVar132._8_4_;
                auVar172._12_4_ = (float)local_518._0_4_ * auVar132._12_4_;
                auVar132 = vmovshdup_avx(auVar131);
                fVar193 = local_428._0_4_ + (float)local_608._0_4_ * auVar131._0_4_;
                auVar128 = vmovshdup_avx(_local_428);
                fVar239 = auVar128._0_4_ + (float)local_608._0_4_ * auVar132._0_4_;
                fVar241 = (float)local_608._0_4_ * fVar245 + (float)local_418._0_4_;
                auVar289._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
                auVar289._8_4_ = auVar131._8_4_ ^ 0x80000000;
                auVar289._12_4_ = auVar131._12_4_ ^ 0x80000000;
                aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = -fVar245;
                aStack_2b8._84_4_ = fStack_564;
                aStack_2b8._80_4_ = local_568;
                aStack_2b8._88_4_ = fStack_560;
                aStack_2b8.mi.sigma_a.values.values[1] = fStack_55c;
                aStack_2b8._48_8_ = &this_01[0x66666666666].values.ptr;
                aStack_2b8._60_4_ = (uint)((ulong)&this_01[3].values >> 0x20) | 0x10000;
                auVar222._4_4_ = fVar193;
                auVar222._0_4_ = fVar193;
                auVar222._8_4_ = fVar193;
                auVar222._12_4_ = fVar193;
                auVar308._4_4_ = fVar239;
                auVar308._0_4_ = fVar239;
                auVar308._8_4_ = fVar239;
                auVar308._12_4_ = fVar239;
                auVar131 = vmovlhps_avx(auVar222,auVar308);
                auVar309._4_4_ = fVar241;
                auVar309._0_4_ = fVar241;
                auVar309._8_4_ = fVar241;
                auVar309._12_4_ = fVar241;
                aStack_2b8._16_12_ = ZEXT812(0);
                aStack_2b8.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = (float)0;
                aStack_2b8.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
                local_2d0._0_4_ = auVar131._0_4_;
                local_2d0._4_4_ = auVar131._4_4_;
                local_2d0._8_4_ = auVar131._8_4_;
                local_2d0._12_4_ = auVar131._12_4_;
                uVar189 = vmovlps_avx(auVar309);
                local_2d0._16_4_ = (undefined4)uVar189;
                local_2d0._20_4_ = (undefined4)((ulong)uVar189 >> 0x20);
                aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low =
                     (Float)vextractps_avx(_local_528,1);
                uVar189 = vmovlps_avx(auVar289);
                aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar189;
                aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = (Float)((ulong)uVar189 >> 0x20);
                aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
                aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
                aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                     SUB84(&this_01[3].values,0);
                auVar131 = vunpcklpd_avx(_local_5e8,auVar130);
                aStack_2b8._64_4_ = auVar131._0_4_;
                aStack_2b8._68_4_ = auVar131._4_4_;
                aStack_2b8.ei.super_Interaction.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits = auVar131._8_8_;
                auVar225._16_16_ = auVar172;
                auVar225._0_16_ = auVar251;
                auVar269._16_16_ = auVar155;
                auVar269._0_16_ = auVar172;
                auVar178 = vperm2f128_avx(auVar269,ZEXT1632(auVar172),0x21);
                auVar178 = vshufpd_avx(auVar225,auVar178,8);
                aStack_2b8._96_8_ = auVar178._0_8_;
                aStack_2b8._104_8_ = auVar178._8_8_;
                aStack_2b8._112_8_ = auVar178._16_8_;
                aStack_2b8._120_8_ = auVar178._24_8_;
                in_ZMM10 = ZEXT1664(_local_528);
                in_ZMM12 = ZEXT1664(_local_5e8);
                aStack_2b8.mi.sigma_maj.values.values[2] = in_ZmmResult._0_4_;
                aStack_2b8.mi.sigma_maj.values.values[3] = in_ZmmResult._4_4_;
                aStack_2b8.mi.Le.values.values[0] = in_ZmmResult._8_4_;
                aStack_2b8.mi.Le.values.values[1] = in_ZmmResult._12_4_;
                RandomWalk::anon_class_88_11_14aa307c::operator()
                          (&local_480,(MediumSample *)local_2d0);
                auVar134._8_4_ = 0x3f800000;
                auVar134._0_8_ = 0x3f8000003f800000;
                auVar134._12_4_ = 0x3f800000;
                auVar131._8_4_ = 0x80000000;
                auVar131._0_8_ = 0x8000000080000000;
                auVar131._12_4_ = 0x80000000;
              }
            }
            else {
              auVar131._8_4_ = 0x80000000;
              auVar131._0_8_ = 0x8000000080000000;
              auVar131._12_4_ = 0x80000000;
              auVar151._0_4_ = fVar192 * -fVar193;
              auVar151._4_4_ = fVar238 * -fVar193;
              auVar151._8_4_ = fVar240 * -fVar193;
              auVar151._12_4_ = fVar244 * -fVar193;
              auVar35._8_4_ = 0x3fb8aa3b;
              auVar35._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar35._12_4_ = 0x3fb8aa3b;
              auVar128 = vmulps_avx512vl(auVar151,auVar35);
              auVar132 = vroundps_avx(auVar128,9);
              auVar128 = vsubps_avx(auVar128,auVar132);
              auVar196._0_4_ = (int)auVar132._0_4_;
              auVar196._4_4_ = (int)auVar132._4_4_;
              auVar196._8_4_ = (int)auVar132._8_4_;
              auVar196._12_4_ = (int)auVar132._12_4_;
              auVar247._8_4_ = 0x3da00ac9;
              auVar247._0_8_ = 0x3da00ac93da00ac9;
              auVar247._12_4_ = 0x3da00ac9;
              auVar36._8_4_ = 0x3e679a0b;
              auVar36._0_8_ = 0x3e679a0b3e679a0b;
              auVar36._12_4_ = 0x3e679a0b;
              auVar132 = vfmadd213ps_avx512vl(auVar247,auVar128,auVar36);
              auVar37._8_4_ = 0x3f321004;
              auVar37._0_8_ = 0x3f3210043f321004;
              auVar37._12_4_ = 0x3f321004;
              auVar132 = vfmadd213ps_avx512vl(auVar132,auVar128,auVar37);
              auVar38._8_4_ = 0x3f800000;
              auVar38._0_8_ = 0x3f8000003f800000;
              auVar38._12_4_ = 0x3f800000;
              auVar128 = vfmadd213ps_avx512vl(auVar132,auVar128,auVar38);
              auVar130 = vpsrld_avx(auVar128,0x17);
              auVar275._8_4_ = 0xffffff81;
              auVar275._0_8_ = 0xffffff81ffffff81;
              auVar275._12_4_ = 0xffffff81;
              auVar132 = vpaddd_avx(auVar196,auVar275);
              auVar132 = vpaddd_avx(auVar132,auVar130);
              uVar123 = vpcmpgtd_avx512vl(auVar132,auVar275);
              uVar123 = uVar123 & 0xf;
              auVar39._8_4_ = 0x7f;
              auVar39._0_8_ = 0x7f0000007f;
              auVar39._12_4_ = 0x7f;
              uVar111 = vpcmpgtd_avx512vl(auVar132,auVar39);
              uVar111 = uVar111 & 0xf;
              auVar40._8_4_ = 0x807fffff;
              auVar40._0_8_ = 0x807fffff807fffff;
              auVar40._12_4_ = 0x807fffff;
              auVar128 = vpandd_avx512vl(auVar128,auVar40);
              auVar132 = vpslld_avx(auVar132,0x17);
              auVar41._8_4_ = 0x3f800000;
              auVar41._0_8_ = 0x3f8000003f800000;
              auVar41._12_4_ = 0x3f800000;
              auVar132 = vpaddd_avx512vl(auVar132,auVar41);
              auVar132 = vpord_avx512vl(auVar132,auVar128);
              auVar128 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar124 = (bool)((byte)uVar111 & 1);
              auVar134._0_4_ =
                   (uint)bVar124 * auVar128._0_4_ |
                   (uint)!bVar124 * (uint)((byte)uVar123 & 1) * auVar132._0_4_;
              bVar124 = (bool)((byte)(uVar111 >> 1) & 1);
              auVar134._4_4_ =
                   (uint)bVar124 * auVar128._4_4_ |
                   (uint)!bVar124 * (uint)((byte)(uVar123 >> 1) & 1) * auVar132._4_4_;
              bVar124 = (bool)((byte)(uVar111 >> 2) & 1);
              auVar134._8_4_ =
                   (uint)bVar124 * auVar128._8_4_ |
                   (uint)!bVar124 * (uint)((byte)(uVar123 >> 2) & 1) * auVar132._8_4_;
              bVar124 = SUB81(uVar111 >> 3,0);
              auVar134._12_4_ =
                   (uint)bVar124 * auVar128._12_4_ |
                   (uint)!bVar124 * (uint)(byte)(uVar123 >> 3) * auVar132._12_4_;
              in_ZmmResult._0_16_ = auVar134;
            }
            auVar132 = vshufpd_avx(auVar134,auVar134,1);
          }
        }
        else {
          unique0x000f4700 = vmovlhps_avx(auVar130,auVar132);
          if (sVar100 == 3) {
            local_4c0._0_8_ = vmovlps_avx(auVar128);
            local_480.terminated = &local_611;
            local_480.beta = &local_4e8;
            local_480.vertex = local_550;
            local_480.pdfFwd = &local_5ec;
            local_480.prev = local_500;
            local_480.bounces = &local_60c;
            local_480.maxDepth = &maxDepth;
            local_480.anyNonSpecularBounces = &local_612;
            local_480.scattered = &local_613;
            local_590 = CONCAT44(local_590._4_4_,local_608._0_4_);
            puVar112 = (undefined8 *)(TVar6.bits & 0xffffffffffff);
            local_4c0._8_4_ = fVar193;
            local_4a0.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                     )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )TVar6.bits;
            Transform::ApplyInverse
                      ((Ray *)local_5d8,(Transform *)(puVar112 + 0xf),(Ray *)local_4c0,
                       (Float *)&local_590);
            auVar195._0_4_ = afStack_5cc[1] * afStack_5cc[1];
            auVar195._4_4_ = afStack_5cc[2] * afStack_5cc[2];
            auVar195._8_8_ = 0;
            auVar131 = vmovshdup_avx(auVar195);
            fVar193 = afStack_5cc[0] * afStack_5cc[0] + auVar195._0_4_ + auVar131._0_4_;
            if (fVar193 < 0.0) {
              fVar193 = sqrtf(fVar193);
            }
            else {
              auVar131 = vsqrtss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193));
              fVar193 = auVar131._0_4_;
            }
            local_590 = CONCAT44(local_590._4_4_,fVar193 * (float)local_590);
            auVar198._0_4_ = afStack_5cc[1] * afStack_5cc[1];
            auVar198._4_4_ = afStack_5cc[2] * afStack_5cc[2];
            auVar198._8_8_ = 0;
            auVar131 = vmovshdup_avx(auVar198);
            fVar193 = afStack_5cc[0] * afStack_5cc[0] + auVar198._0_4_ + auVar131._0_4_;
            if (fVar193 < 0.0) {
              fVar193 = sqrtf(fVar193);
            }
            else {
              auVar131 = vsqrtss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193));
              fVar193 = auVar131._0_4_;
            }
            auVar131._8_4_ = 0x80000000;
            auVar131._0_8_ = 0x8000000080000000;
            auVar131._12_4_ = 0x80000000;
            auVar207._4_4_ = afStack_5cc[1];
            auVar207._0_4_ = afStack_5cc[0];
            auVar207._8_8_ = 0;
            auVar253._4_4_ = fVar193;
            auVar253._0_4_ = fVar193;
            auVar253._8_4_ = fVar193;
            auVar253._12_4_ = fVar193;
            auVar132 = vdivps_avx(auVar207,auVar253);
            uVar189 = vmovlps_avx(auVar132);
            afStack_5cc[0] = (float)uVar189;
            afStack_5cc[1] = (float)((ulong)uVar189 >> 0x20);
            afStack_5cc[2] = afStack_5cc[2] / fVar193;
            local_568 = (float)local_590;
            auVar132 = ZEXT816(0) << 0x40;
            bVar124 = false;
            uVar118 = 0;
            do {
              pfVar119 = afStack_5cc;
              if ((uVar118 != 0) && (pfVar119 = afStack_5cc + 1, uVar118 != 1)) {
                pfVar119 = afStack_5cc + 2;
              }
              pfVar115 = (float *)(puVar112 + 1);
              if ((uVar118 != 0) && (pfVar115 = (float *)((long)puVar112 + 0xc), uVar118 != 1)) {
                pfVar115 = (float *)(puVar112 + 2);
              }
              pfVar120 = (float *)local_5d8;
              if ((uVar118 != 0) && (pfVar120 = (float *)(local_5d8 + 4), uVar118 != 1)) {
                pfVar120 = &fStack_5d0;
              }
              pfVar121 = (float *)((long)puVar112 + 0x14);
              if ((uVar118 != 0) && (pfVar121 = (float *)(puVar112 + 3), uVar118 != 1)) {
                pfVar121 = (float *)((long)puVar112 + 0x1c);
              }
              pfVar122 = (float *)local_5d8;
              if ((uVar118 != 0) && (pfVar122 = (float *)(local_5d8 + 4), uVar118 != 1)) {
                pfVar122 = &fStack_5d0;
              }
              auVar130 = ZEXT416((uint)((1.0 / *pfVar119) * (*pfVar121 - *pfVar122)));
              auVar155 = ZEXT416((uint)((1.0 / *pfVar119) * (*pfVar115 - *pfVar120)));
              auVar128 = vminss_avx(auVar130,auVar155);
              auVar132 = vmaxss_avx(auVar128,auVar132);
              auVar128 = vmaxss_avx(auVar155,auVar130);
              auVar128 = vminss_avx(ZEXT416((uint)(auVar128._0_4_ * 1.0000004)),
                                    ZEXT416((uint)local_568));
              auVar243 = ZEXT856(auVar128._8_8_);
              local_568 = auVar128._0_4_;
              if (auVar128._0_4_ < auVar132._0_4_) break;
              bVar124 = 1 < uVar118;
              uVar118 = uVar118 + 1;
            } while (uVar118 != 3);
            auVar134._8_4_ = 0x3f800000;
            auVar134._0_8_ = 0x3f8000003f800000;
            auVar134._12_4_ = 0x3f800000;
            if (bVar124) {
              uVar189 = 0;
              _local_5e8 = ZEXT416(*(uint *)(puVar112 + 0xe));
              _local_608 = auVar132;
              SVar325 = DenselySampledSpectrum::Sample
                                  ((DenselySampledSpectrum *)(puVar112 + 4),lambda);
              auVar231._0_8_ = SVar325.values.values._8_8_;
              auVar231._8_56_ = auVar243;
              uStack_530 = uVar189;
              local_538 = (undefined1  [8])SVar325.values.values._0_8_;
              _local_548 = auVar231._0_16_;
              auVar191 = (undefined1  [56])0x0;
              _local_528 = ZEXT416(*(uint *)(puVar112 + 0xe));
              SVar325 = DenselySampledSpectrum::Sample
                                  ((DenselySampledSpectrum *)(puVar112 + 9),lambda);
              uVar273 = aStack_2b8._60_4_;
              auVar128 = _local_608;
              auVar232._0_8_ = SVar325.values.values._8_8_;
              auVar232._8_56_ = auVar243;
              auVar183._0_8_ = SVar325.values.values._0_8_;
              auVar183._8_56_ = auVar191;
              auVar131 = vunpcklpd_avx(_local_538,_local_548);
              local_358 = (float)local_5e8._0_4_ * auVar131._0_4_;
              fStack_354 = (float)local_5e8._0_4_ * auVar131._4_4_;
              fStack_350 = (float)local_5e8._0_4_ * auVar131._8_4_;
              fStack_34c = (float)local_5e8._0_4_ * auVar131._12_4_;
              auVar131 = vmovlhps_avx(auVar183._0_16_,auVar232._0_16_);
              local_368 = (float)local_528._0_4_ * auVar131._0_4_;
              fStack_364 = (float)local_528._0_4_ * auVar131._4_4_;
              fStack_360 = (float)local_528._0_4_ * auVar131._8_4_;
              fStack_35c = (float)local_528._0_4_ * auVar131._12_4_;
              local_3d8._0_4_ = local_368 + local_358;
              local_3d8._4_4_ = fStack_364 + fStack_354;
              local_3d8._8_4_ = fStack_360 + fStack_350;
              local_3d8._12_4_ = fStack_35c + fStack_34c;
              auVar314 = ZEXT1664(local_3d8);
              fVar193 = *(float *)(puVar112 + 2);
              fVar245 = *(float *)((long)puVar112 + 0x1c) - fVar193;
              uVar189 = vcmpss_avx512f(ZEXT416((uint)fVar193),
                                       ZEXT416((uint)*(float *)((long)puVar112 + 0x1c)),1);
              bVar11 = (bool)((byte)uVar189 & 1);
              auVar159._8_8_ = 0;
              auVar159._0_8_ = puVar112[1];
              auVar208._8_8_ = 0;
              auVar208._0_8_ = *(ulong *)((long)puVar112 + 0x14);
              auVar131 = vsubps_avx(auVar208,auVar159);
              auVar301._4_4_ = local_5d8._4_4_;
              auVar301._0_4_ = local_5d8._0_4_;
              auVar301._8_8_ = 0;
              auVar132 = vsubps_avx(auVar301,auVar159);
              uVar111 = vcmpps_avx512vl(auVar159,auVar208,1);
              auVar130 = vdivps_avx512vl(auVar132,auVar131);
              bVar124 = (bool)((byte)uVar111 & 1);
              auVar135._0_4_ =
                   (float)((uint)bVar124 * auVar130._0_4_ | (uint)!bVar124 * auVar132._0_4_);
              bVar124 = (bool)((byte)(uVar111 >> 1) & 1);
              auVar135._4_4_ = (uint)bVar124 * auVar130._4_4_ | (uint)!bVar124 * auVar132._4_4_;
              bVar124 = (bool)((byte)(uVar111 >> 2) & 1);
              auVar135._8_4_ = (uint)bVar124 * auVar130._8_4_ | (uint)!bVar124 * auVar132._8_4_;
              bVar124 = (bool)((byte)(uVar111 >> 3) & 1);
              auVar135._12_4_ = (uint)bVar124 * auVar130._12_4_ | (uint)!bVar124 * auVar132._12_4_;
              in_ZmmResult._0_16_ = auVar135;
              auVar132 = vmovshdup_avx(auVar135);
              auVar160._4_4_ = afStack_5cc[1];
              auVar160._0_4_ = afStack_5cc[0];
              auVar160._8_8_ = 0;
              auVar131 = vdivps_avx(auVar160,auVar131);
              local_610 = afStack_5cc[2] / fVar245;
              uVar189 = vmovlps_avx(auVar131);
              local_580.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar189;
              local_580.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar189 >> 0x20);
              fVar150 = local_608._0_4_;
              fVar239 = fVar150 * local_580.super_Tuple3<pbrt::Point3,_float>.x + auVar135._0_4_;
              fVar241 = fVar150 * local_580.super_Tuple3<pbrt::Point3,_float>.y + auVar132._0_4_;
              fVar193 = (float)((uint)bVar11 * (int)((fStack_5d0 - fVar193) / fVar245) +
                               (uint)!bVar11 * (int)(fStack_5d0 - fVar193)) + fVar150 * local_610;
              piVar1 = (int *)(puVar112 + 0x23);
              piVar2 = (int *)((long)puVar112 + 0x11c);
              piVar109 = (int *)(puVar112 + 0x24);
              lVar110 = 0;
              auVar304 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              pfVar119 = &local_580.super_Tuple3<pbrt::Point3,_float>.y;
              do {
                iVar113 = (int)lVar110;
                fVar245 = fVar239;
                if ((iVar113 != 0) && (fVar245 = fVar241, iVar113 != 1)) {
                  fVar245 = fVar193;
                }
                piVar116 = piVar1;
                if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                  piVar116 = piVar109;
                }
                piVar117 = piVar1;
                if ((iVar113 != 0) && (piVar117 = piVar2, iVar113 != 1)) {
                  piVar117 = piVar109;
                }
                auVar293._0_4_ = (float)(*piVar117 + -1);
                auVar293._4_12_ = in_ZMM10._4_12_;
                auVar131 = vminss_avx(auVar293,ZEXT416((uint)(fVar245 * (float)*piVar116)));
                uVar189 = vcmpss_avx512f(ZEXT416((uint)(fVar245 * (float)*piVar116)),
                                         ZEXT816(0) << 0x40,1);
                auVar141._16_48_ = in_ZmmResult._16_48_;
                auVar141._0_16_ = auVar131;
                fVar245 = (float)((uint)!(bool)((byte)uVar189 & 1) * auVar131._0_4_);
                in_ZmmResult._4_60_ = auVar141._4_60_;
                in_ZmmResult._0_4_ = fVar245;
                iVar114 = (int)fVar245;
                local_574[lVar110] = iVar114;
                pfVar115 = (float *)&local_580;
                if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                  pfVar115 = &local_610;
                }
                if ((*pfVar115 == 0.0) && (!NAN(*pfVar115))) {
                  pfVar115 = (float *)&local_580;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_610;
                  }
                  *pfVar115 = 0.0;
                }
                pfVar115 = (float *)&local_580;
                if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                  pfVar115 = &local_610;
                }
                if (0.0 <= *pfVar115) {
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  fVar245 = fVar239;
                  if ((iVar113 != 0) && (fVar245 = fVar241, iVar113 != 1)) {
                    fVar245 = fVar193;
                  }
                  pfVar115 = (float *)&local_580;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_610;
                  }
                  local_59c[lVar110] =
                       fVar150 + ((float)(iVar114 + 1) / (float)*piVar116 - fVar245) / *pfVar115;
                  pfVar115 = (float *)&local_580;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_610;
                  }
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  afStack_48c[lVar110] = 1.0 / ((float)*piVar116 * *pfVar115);
                  aiStack_498[lVar110] = 1;
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  iVar113 = *piVar116;
                }
                else {
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  fVar245 = fVar239;
                  if ((iVar113 != 0) && (fVar245 = fVar241, iVar113 != 1)) {
                    fVar245 = fVar193;
                  }
                  pfVar115 = (float *)&local_580;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_610;
                  }
                  local_59c[lVar110] =
                       fVar150 + ((float)iVar114 / (float)*piVar116 - fVar245) / *pfVar115;
                  pfVar115 = (float *)&local_580;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_610;
                  }
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  afStack_48c[lVar110] = -1.0 / ((float)*piVar116 * *pfVar115);
                  aiStack_498[lVar110] = -1;
                  iVar113 = -1;
                }
                aiStack_3e4[lVar110] = iVar113;
                lVar110 = lVar110 + 1;
              } while (lVar110 != 3);
              aStack_2b8._60_4_ = (uint)((ulong)((long)puVar112 + 0x74) >> 0x20) | 0x10000;
              uVar107 = aStack_2b8._60_4_;
              fStack_5e0 = 1.0;
              local_5e8 = (undefined1  [8])0x3f8000003f800000;
              fStack_5dc = 1.0;
              auVar318 = ZEXT464((uint)local_518._0_4_);
              aStack_2b8._60_4_ = uVar273;
              do {
                iVar113 = *(int *)(&DAT_005841e0 +
                                  (ulong)((uint)(local_59c[1] < local_59c[2]) |
                                         (uint)(local_59c[0] < local_59c[1]) * 4 +
                                         (uint)(local_59c[0] < local_59c[2]) * 2) * 4);
                uVar273 = *(undefined4 *)
                           (puVar112[0x20] +
                           (((long)local_574[2] * (long)*(int *)((long)puVar112 + 0x11c) +
                            (long)local_574[1]) * (long)*(int *)(puVar112 + 0x23) +
                           (long)local_574[0]) * 4);
                auVar56._4_4_ = uVar273;
                auVar56._0_4_ = uVar273;
                auVar56._8_4_ = uVar273;
                auVar56._12_4_ = uVar273;
                in_ZmmResult._0_16_ = vmulps_avx512vl(auVar314._0_16_,auVar56);
                auVar131 = vminss_avx(ZEXT416((uint)local_59c[iVar113]),ZEXT416((uint)local_568));
                fVar150 = in_ZmmResult._0_4_;
                fVar193 = (float)((uint)fVar150 ^ auVar304._0_4_);
                fVar239 = (float)(in_ZmmResult._4_4_ ^ auVar304._4_4_);
                fVar241 = (float)(in_ZmmResult._8_4_ ^ auVar304._8_4_);
                fVar245 = (float)(in_ZmmResult._12_4_ ^ auVar304._12_4_);
                if ((fVar150 != 0.0) || (NAN(fVar150))) {
                  local_528._4_4_ = fVar239;
                  local_528._0_4_ = fVar193;
                  fStack_520 = fVar241;
                  fStack_51c = fVar245;
                  local_548._0_4_ = auVar131._0_4_;
                  _local_608 = auVar128;
                  _local_538 = in_ZmmResult._0_16_;
                  do {
                    fVar193 = logf(1.0 - auVar318._0_4_);
                    fVar193 = (float)local_608._0_4_ - fVar193 / (float)local_538._0_4_;
                    uVar118 = (uint)(uVar123 >> 0x2d) ^ (uint)(uVar123 >> 0x1b);
                    bVar108 = (byte)(uVar123 >> 0x3b);
                    auVar132 = in_ZMM12._0_16_;
                    auVar131 = vcvtusi2ss_avx512f(auVar132,uVar118 >> bVar108 |
                                                           uVar118 << 0x20 - bVar108);
                    auVar131 = vminss_avx(ZEXT416((uint)(auVar131._0_4_ * 2.3283064e-10)),
                                          ZEXT416(0x3f7fffff));
                    auVar318 = ZEXT1664(auVar131);
                    if ((float)local_548._0_4_ <= fVar193) {
                      fVar193 = (float)local_548._0_4_ - (float)local_608._0_4_;
                      auVar163._0_4_ = fVar193 * (float)local_528._0_4_;
                      auVar163._4_4_ = fVar193 * (float)local_528._4_4_;
                      auVar163._8_4_ = fVar193 * fStack_520;
                      auVar163._12_4_ = fVar193 * fStack_51c;
                      auVar71._8_4_ = 0x3fb8aa3b;
                      auVar71._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar71._12_4_ = 0x3fb8aa3b;
                      auVar132 = vmulps_avx512vl(auVar163,auVar71);
                      auVar131 = vroundps_avx(auVar132,9);
                      auVar132 = vsubps_avx(auVar132,auVar131);
                      auVar212._0_4_ = (int)auVar131._0_4_;
                      auVar212._4_4_ = (int)auVar131._4_4_;
                      auVar212._8_4_ = (int)auVar131._8_4_;
                      auVar212._12_4_ = (int)auVar131._12_4_;
                      auVar255._8_4_ = 0x3da00ac9;
                      auVar255._0_8_ = 0x3da00ac93da00ac9;
                      auVar255._12_4_ = 0x3da00ac9;
                      auVar72._8_4_ = 0x3e679a0b;
                      auVar72._0_8_ = 0x3e679a0b3e679a0b;
                      auVar72._12_4_ = 0x3e679a0b;
                      auVar131 = vfmadd213ps_avx512vl(auVar255,auVar132,auVar72);
                      auVar73._8_4_ = 0x3f321004;
                      auVar73._0_8_ = 0x3f3210043f321004;
                      auVar73._12_4_ = 0x3f321004;
                      auVar131 = vfmadd213ps_avx512vl(auVar131,auVar132,auVar73);
                      auVar74._8_4_ = 0x3f800000;
                      auVar74._0_8_ = 0x3f8000003f800000;
                      auVar74._12_4_ = 0x3f800000;
                      auVar132 = vfmadd213ps_avx512vl(auVar131,auVar132,auVar74);
                      auVar128 = vpsrld_avx(auVar132,0x17);
                      auVar281._8_4_ = 0xffffff81;
                      auVar281._0_8_ = 0xffffff81ffffff81;
                      auVar281._12_4_ = 0xffffff81;
                      auVar131 = vpaddd_avx(auVar212,auVar281);
                      auVar131 = vpaddd_avx(auVar131,auVar128);
                      uVar111 = vpcmpgtd_avx512vl(auVar131,auVar281);
                      uVar111 = uVar111 & 0xf;
                      auVar75._8_4_ = 0x7f;
                      auVar75._0_8_ = 0x7f0000007f;
                      auVar75._12_4_ = 0x7f;
                      uVar126 = vpcmpgtd_avx512vl(auVar131,auVar75);
                      uVar126 = uVar126 & 0xf;
                      auVar76._8_4_ = 0x807fffff;
                      auVar76._0_8_ = 0x807fffff807fffff;
                      auVar76._12_4_ = 0x807fffff;
                      auVar132 = vpandd_avx512vl(auVar132,auVar76);
                      auVar131 = vpslld_avx(auVar131,0x17);
                      auVar77._8_4_ = 0x3f800000;
                      auVar77._0_8_ = 0x3f8000003f800000;
                      auVar77._12_4_ = 0x3f800000;
                      auVar131 = vpaddd_avx512vl(auVar131,auVar77);
                      auVar131 = vpord_avx512vl(auVar131,auVar132);
                      auVar132 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                      bVar124 = (bool)((byte)uVar126 & 1);
                      in_ZmmResult._0_4_ =
                           (float)((uint)bVar124 * auVar132._0_4_ |
                                  (uint)!bVar124 * (uint)((byte)uVar111 & 1) * auVar131._0_4_);
                      bVar124 = (bool)((byte)(uVar126 >> 1) & 1);
                      in_ZmmResult._4_4_ =
                           (float)((uint)bVar124 * auVar132._4_4_ |
                                  (uint)!bVar124 * (uint)((byte)(uVar111 >> 1) & 1) * auVar131._4_4_
                                  );
                      bVar124 = (bool)((byte)(uVar126 >> 2) & 1);
                      in_ZmmResult._8_4_ =
                           (float)((uint)bVar124 * auVar132._8_4_ |
                                  (uint)!bVar124 * (uint)((byte)(uVar111 >> 2) & 1) * auVar131._8_4_
                                  );
                      bVar124 = SUB81(uVar126 >> 3,0);
                      in_ZmmResult._12_4_ =
                           (float)((uint)bVar124 * auVar132._12_4_ |
                                  (uint)!bVar124 * (uint)(byte)(uVar111 >> 3) * auVar131._12_4_);
                      local_5e8._4_4_ = in_ZmmResult._4_4_ * (float)local_5e8._4_4_;
                      local_5e8._0_4_ = in_ZmmResult._0_4_ * (float)local_5e8._0_4_;
                      fStack_5e0 = in_ZmmResult._8_4_ * fStack_5e0;
                      fStack_5dc = in_ZmmResult._12_4_ * fStack_5dc;
                      cVar125 = '\n';
                    }
                    else {
                      cVar125 = '\0';
                      if (local_568 <= fVar193) {
                        _local_608 = ZEXT416((uint)fVar193);
                      }
                      else {
                        local_518._0_4_ = auVar131._0_4_;
                        fVar239 = fVar193 - (float)local_608._0_4_;
                        auVar162._0_4_ = fVar239 * (float)local_528._0_4_;
                        auVar162._4_4_ = fVar239 * (float)local_528._4_4_;
                        auVar162._8_4_ = fVar239 * fStack_520;
                        auVar162._12_4_ = fVar239 * fStack_51c;
                        auVar64._8_4_ = 0x3fb8aa3b;
                        auVar64._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar64._12_4_ = 0x3fb8aa3b;
                        auVar131 = vmulps_avx512vl(auVar162,auVar64);
                        _local_428 = vroundps_avx(auVar131,9);
                        auVar131 = vsubps_avx(auVar131,_local_428);
                        auVar210._8_4_ = 0x3da00ac9;
                        auVar210._0_8_ = 0x3da00ac93da00ac9;
                        auVar210._12_4_ = 0x3da00ac9;
                        auVar65._8_4_ = 0x3e679a0b;
                        auVar65._0_8_ = 0x3e679a0b3e679a0b;
                        auVar65._12_4_ = 0x3e679a0b;
                        auVar128 = vfmadd213ps_avx512vl(auVar210,auVar131,auVar65);
                        auVar66._8_4_ = 0x3f321004;
                        auVar66._0_8_ = 0x3f3210043f321004;
                        auVar66._12_4_ = 0x3f321004;
                        auVar128 = vfmadd213ps_avx512vl(auVar128,auVar131,auVar66);
                        auVar67._8_4_ = 0x3f800000;
                        auVar67._0_8_ = 0x3f8000003f800000;
                        auVar67._12_4_ = 0x3f800000;
                        local_418 = vfmadd213ps_avx512vl(auVar128,auVar131,auVar67);
                        fVar241 = fVar193 * afStack_5cc[0] + (float)local_5d8._0_4_;
                        fVar245 = fVar193 * afStack_5cc[1] + (float)local_5d8._4_4_;
                        local_4f8 = CONCAT412(fVar193 * 0.0 + 0.0,
                                              CONCAT48(fVar193 * 0.0 + 0.0,CONCAT44(fVar245,fVar241)
                                                      ));
                        fVar239 = fVar193 * afStack_5cc[2] + fStack_5d0;
                        local_4d8._0_4_ = fVar239;
                        p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar239;
                        p_00.super_Tuple3<pbrt::Point3,_float>.x = fVar241;
                        p_00.super_Tuple3<pbrt::Point3,_float>.y = fVar245;
                        auVar191 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                        auVar243 = ZEXT856(local_4f8._8_8_);
                        local_348 = ZEXT416((uint)fVar193);
                        SVar325 = CloudMediumProvider::Density
                                            ((CloudMediumProvider *)*puVar112,p_00,lambda);
                        auVar233._0_8_ = SVar325.values.values._8_8_;
                        auVar233._8_56_ = auVar191;
                        auVar184._0_8_ = SVar325.values.values._0_8_;
                        auVar184._8_56_ = auVar243;
                        auVar131 = vmovshdup_avx(local_4f8);
                        fVar241 = auVar131._0_4_;
                        auVar131 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 *
                                                                 *(float *)((long)puVar112 + 0x7c)))
                                                   ,local_4f8,ZEXT416(*(uint *)(puVar112 + 0xf)));
                        auVar131 = vfmadd231ss_fma(auVar131,ZEXT416((uint)local_4d8._0_4_),
                                                   ZEXT416(*(uint *)(puVar112 + 0x10)));
                        fVar193 = auVar131._0_4_ + *(float *)((long)puVar112 + 0x84);
                        auVar131 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 *
                                                                 *(float *)((long)puVar112 + 0x8c)))
                                                   ,local_4f8,ZEXT416(*(uint *)(puVar112 + 0x11)));
                        auVar131 = vfmadd231ss_fma(auVar131,ZEXT416((uint)local_4d8._0_4_),
                                                   ZEXT416(*(uint *)(puVar112 + 0x12)));
                        fVar239 = auVar131._0_4_ + *(float *)((long)puVar112 + 0x94);
                        auVar131 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 *
                                                                 *(float *)((long)puVar112 + 0x9c)))
                                                   ,local_4f8,ZEXT416(*(uint *)(puVar112 + 0x13)));
                        auVar131 = vfmadd231ss_fma(auVar131,ZEXT416((uint)local_4d8._0_4_),
                                                   ZEXT416(*(uint *)(puVar112 + 0x14)));
                        auVar128 = vfmadd231ss_fma(ZEXT416((uint)(fVar241 *
                                                                 *(float *)((long)puVar112 + 0xac)))
                                                   ,local_4f8,ZEXT416(*(uint *)(puVar112 + 0x15)));
                        auVar128 = vfmadd231ss_fma(auVar128,ZEXT416((uint)local_4d8._0_4_),
                                                   ZEXT416(*(uint *)(puVar112 + 0x16)));
                        fVar241 = auVar128._0_4_ + *(float *)((long)puVar112 + 0xb4);
                        bVar124 = fVar241 == 1.0;
                        fVar245 = auVar131._0_4_ + *(float *)((long)puVar112 + 0xa4);
                        auVar211._0_4_ = local_4c0._16_4_ * local_4c0._16_4_;
                        auVar211._4_4_ = local_4c0._20_4_ * local_4c0._20_4_;
                        auVar211._8_8_ = 0;
                        auVar131 = vmovshdup_avx(auVar211);
                        fVar150 = (float)local_4c0._12_4_ * (float)local_4c0._12_4_ + auVar211._0_4_
                                  + auVar131._0_4_;
                        if (fVar150 < 0.0) {
                          local_4d8 = ZEXT416((uint)fVar193);
                          local_388 = ZEXT416((uint)fVar239);
                          local_398 = ZEXT416((uint)fVar245);
                          local_3a8._0_4_ = fVar241;
                          local_4f8 = auVar184._0_16_;
                          local_378 = auVar233._0_16_;
                          fVar150 = sqrtf(fVar150);
                          fVar241 = (float)local_3a8._0_4_;
                          auVar128 = local_4f8;
                          auVar131 = local_378;
                          auVar130 = local_4d8;
                          fVar239 = (float)local_388._0_4_;
                          fVar245 = (float)local_398._0_4_;
                        }
                        else {
                          auVar131 = vsqrtss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                          fVar150 = auVar131._0_4_;
                          auVar128 = auVar184._0_16_;
                          auVar131 = auVar233._0_16_;
                          auVar130 = ZEXT416((uint)fVar193);
                        }
                        auVar251 = _local_538;
                        auVar213._0_4_ = (int)(float)local_428._0_4_;
                        auVar213._4_4_ = (int)(float)local_428._4_4_;
                        auVar213._8_4_ = (int)fStack_420;
                        auVar213._12_4_ = (int)fStack_41c;
                        auVar256 = vpsrld_avx(local_418,0x17);
                        auVar282._8_4_ = 0xffffff81;
                        auVar282._0_8_ = 0xffffff81ffffff81;
                        auVar282._12_4_ = 0xffffff81;
                        auVar155 = vpaddd_avx(auVar213,auVar282);
                        auVar155 = vpaddd_avx(auVar155,auVar256);
                        uVar111 = vpcmpgtd_avx512vl(auVar155,auVar282);
                        uVar111 = uVar111 & 0xf;
                        auVar68._8_4_ = 0x7f;
                        auVar68._0_8_ = 0x7f0000007f;
                        auVar68._12_4_ = 0x7f;
                        uVar126 = vpcmpgtd_avx512vl(auVar155,auVar68);
                        uVar126 = uVar126 & 0xf;
                        auVar69._8_4_ = 0x807fffff;
                        auVar69._0_8_ = 0x807fffff807fffff;
                        auVar69._12_4_ = 0x807fffff;
                        auVar256 = vpandd_avx512vl(local_418,auVar69);
                        auVar155 = vpslld_avx(auVar155,0x17);
                        auVar70._8_4_ = 0x3f800000;
                        auVar70._0_8_ = 0x3f8000003f800000;
                        auVar70._12_4_ = 0x3f800000;
                        auVar155 = vpaddd_avx512vl(auVar155,auVar70);
                        auVar256 = vpord_avx512vl(auVar155,auVar256);
                        auVar133 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        bVar11 = (bool)((byte)uVar126 & 1);
                        bVar8 = (bool)((byte)(uVar126 >> 1) & 1);
                        bVar9 = (bool)((byte)(uVar126 >> 2) & 1);
                        bVar10 = SUB81(uVar126 >> 3,0);
                        auVar131 = vmovlhps_avx(auVar128,auVar131);
                        auVar283._0_4_ = auVar131._0_4_ * local_358;
                        auVar283._4_4_ = auVar131._4_4_ * fStack_354;
                        auVar283._8_4_ = auVar131._8_4_ * fStack_350;
                        auVar283._12_4_ = auVar131._12_4_ * fStack_34c;
                        auVar128 = vshufpd_avx(auVar283,auVar283,1);
                        auVar257._0_4_ = auVar131._0_4_ * local_368;
                        auVar257._4_4_ = auVar131._4_4_ * fStack_364;
                        auVar257._8_4_ = auVar131._8_4_ * fStack_360;
                        auVar257._12_4_ = auVar131._12_4_ * fStack_35c;
                        auVar155 = vshufpd_avx(auVar257,auVar257,1);
                        aStack_2b8.mi.sigma_maj.values.values[2] =
                             (float)((uint)bVar11 * auVar133._0_4_ |
                                    (uint)!bVar11 * (uint)((byte)uVar111 & 1) * auVar256._0_4_) *
                             (float)local_5e8._0_4_;
                        aStack_2b8.mi.sigma_maj.values.values[3] =
                             (float)((uint)bVar8 * auVar133._4_4_ |
                                    (uint)!bVar8 * (uint)((byte)(uVar111 >> 1) & 1) * auVar256._4_4_
                                    ) * (float)local_5e8._4_4_;
                        aStack_2b8.mi.Le.values.values[0] =
                             (float)((uint)bVar9 * auVar133._8_4_ |
                                    (uint)!bVar9 * (uint)((byte)(uVar111 >> 2) & 1) * auVar256._8_4_
                                    ) * fStack_5e0;
                        aStack_2b8.mi.Le.values.values[1] =
                             (float)((uint)bVar10 * auVar133._12_4_ |
                                    (uint)!bVar10 * (uint)(byte)(uVar111 >> 3) * auVar256._12_4_) *
                             fStack_5dc;
                        fVar193 = auVar130._0_4_ / fVar241;
                        auVar143._4_12_ = auVar130._4_12_;
                        auVar143._0_4_ = fVar193;
                        auVar143._16_48_ = in_ZmmResult._16_48_;
                        auVar142._4_60_ = auVar143._4_60_;
                        auVar142._0_4_ =
                             (uint)bVar124 * (int)auVar130._0_4_ + (uint)!bVar124 * (int)fVar193;
                        iVar114 = (uint)bVar124 * (int)fVar239 +
                                  (uint)!bVar124 * (int)(fVar239 / fVar241);
                        iVar127 = (uint)bVar124 * (int)fVar245 +
                                  (uint)!bVar124 * (int)(fVar245 / fVar241);
                        auVar316._0_8_ = local_4c0._12_8_ ^ 0x8000000080000000;
                        auVar316._8_4_ = 0x80000000;
                        auVar316._12_4_ = 0x80000000;
                        auVar321._4_4_ = fVar150;
                        auVar321._0_4_ = fVar150;
                        auVar321._8_4_ = fVar150;
                        auVar321._12_4_ = fVar150;
                        auVar131 = vdivps_avx(auVar316,auVar321);
                        auVar322._0_4_ = -fStack_4ac;
                        auVar322._4_4_ = 0x80000000;
                        auVar322._8_4_ = 0x80000000;
                        auVar322._12_4_ = 0x80000000;
                        auVar164._0_4_ = auVar322._0_4_ / fVar150;
                        auVar164._4_12_ = auVar322._4_12_;
                        aStack_2b8._96_8_ = local_538;
                        aStack_2b8.mi.sigma_s.values.values[0] = (float)uStack_530;
                        aStack_2b8.mi.sigma_s.values.values[1] = uStack_530._4_4_;
                        auVar306._4_4_ = iVar114;
                        auVar306._0_4_ = iVar114;
                        auVar306._8_4_ = iVar114;
                        auVar306._12_4_ = iVar114;
                        auVar311._4_4_ = iVar127;
                        auVar311._0_4_ = iVar127;
                        auVar311._8_4_ = iVar127;
                        auVar311._12_4_ = iVar127;
                        aStack_2b8._16_16_ = ZEXT816(0);
                        aStack_2b8.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y =
                             0.0;
                        auVar130 = vshufps_avx(auVar142._0_16_,auVar306,0x40);
                        local_2d0._0_4_ = auVar130._0_4_;
                        local_2d0._4_4_ = auVar130._4_4_;
                        local_2d0._8_4_ = auVar130._8_4_;
                        local_2d0._12_4_ = auVar130._12_4_;
                        uVar189 = vmovlps_avx(auVar311);
                        local_2d0._16_4_ = (undefined4)uVar189;
                        local_2d0._20_4_ = (undefined4)((ulong)uVar189 >> 0x20);
                        aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = FStack_4a8;
                        uVar189 = vmovlps_avx(auVar131);
                        aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar189;
                        aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
                             (Float)((ulong)uVar189 >> 0x20);
                        aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0
                        ;
                        aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0
                        ;
                        aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                             SUB84(local_588,0);
                        aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                             (float)((ulong)local_588 >> 0x20);
                        aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                             (float)((long)puVar112 + 0x74);
                        auVar177._16_16_ = auVar155;
                        auVar177._0_16_ = auVar164;
                        auVar297._16_16_ = auVar128;
                        auVar297._0_16_ = auVar164;
                        auVar178 = vperm2f128_avx(auVar297,auVar177,0x31);
                        auVar267._16_16_ = auVar257;
                        auVar267._0_16_ = auVar283;
                        auVar178 = vunpcklpd_avx(auVar267,auVar178);
                        aStack_2b8._64_4_ = auVar178._0_4_;
                        aStack_2b8._68_4_ = auVar178._4_4_;
                        aStack_2b8.ei.super_Interaction.medium.
                        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                        .bits = auVar178._8_8_;
                        aStack_2b8.si.dpdu.super_Tuple3<pbrt::Vector3,_float> = auVar178._16_12_;
                        aStack_2b8.mi.sigma_a.values.values[1] = auVar178._28_4_;
                        aStack_2b8.mi.sigma_s.values.values[2] = 0.0;
                        aStack_2b8.mi.sigma_s.values.values[3] = 0.0;
                        aStack_2b8.mi.sigma_maj.values.values[0] = 0.0;
                        aStack_2b8.mi.sigma_maj.values.values[1] = 0.0;
                        in_ZMM10 = ZEXT464((uint)FStack_4a8);
                        in_ZMM12 = ZEXT1664(auVar132);
                        _local_538 = auVar251;
                        aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = auVar164._0_4_;
                        aStack_2b8._60_4_ = uVar107;
                        bVar124 = RandomWalk::anon_class_88_11_14aa307c::operator()
                                            (&local_480,(MediumSample *)local_2d0);
                        if (!bVar124) {
                          local_148._8_4_ = 0x3f800000;
                          local_148._0_8_ = 0x3f8000003f800000;
                          local_148._12_4_ = 0x3f800000;
                        }
                        auVar144._16_48_ = in_ZmmResult._16_48_;
                        auVar144._0_16_ = _local_608;
                        in_ZmmResult._4_60_ = auVar144._4_60_;
                        in_ZmmResult._0_4_ =
                             (float)((uint)bVar124 * local_348._0_4_ +
                                    (uint)!bVar124 * local_608._0_4_);
                        _local_608 = in_ZmmResult._0_16_;
                        cVar125 = !bVar124;
                        fStack_5e0 = 1.0;
                        local_5e8 = (undefined1  [8])0x3f8000003f800000;
                        fStack_5dc = 1.0;
                        auVar318 = ZEXT464((uint)local_518._0_4_);
                        lambda = local_330;
                      }
                    }
                    uVar123 = uVar123 * 0x5851f42d4c957f2d + (long)local_3c8;
                  } while (cVar125 == '\0');
                  auVar128 = _local_608;
                  if (cVar125 == '\n') {
                    auVar304 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)
                                                 ));
                    auVar314 = ZEXT1664(local_3d8);
                    auVar131 = ZEXT416((uint)local_548._0_4_);
                    goto LAB_00405da7;
                  }
                  auVar304 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)))
                  ;
                  auVar314 = ZEXT1664(local_3d8);
                }
                else {
                  fVar150 = auVar131._0_4_ - auVar128._0_4_;
                  auVar161._0_4_ = fVar150 * fVar193;
                  auVar161._4_4_ = fVar150 * fVar239;
                  auVar161._8_4_ = fVar150 * fVar241;
                  auVar161._12_4_ = fVar150 * fVar245;
                  auVar57._8_4_ = 0x3fb8aa3b;
                  auVar57._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar57._12_4_ = 0x3fb8aa3b;
                  auVar130 = vmulps_avx512vl(auVar161,auVar57);
                  auVar132 = vroundps_avx(auVar130,9);
                  auVar130 = vsubps_avx(auVar130,auVar132);
                  auVar209._0_4_ = (int)auVar132._0_4_;
                  auVar209._4_4_ = (int)auVar132._4_4_;
                  auVar209._8_4_ = (int)auVar132._8_4_;
                  auVar209._12_4_ = (int)auVar132._12_4_;
                  auVar254._8_4_ = 0x3da00ac9;
                  auVar254._0_8_ = 0x3da00ac93da00ac9;
                  auVar254._12_4_ = 0x3da00ac9;
                  auVar58._8_4_ = 0x3e679a0b;
                  auVar58._0_8_ = 0x3e679a0b3e679a0b;
                  auVar58._12_4_ = 0x3e679a0b;
                  auVar132 = vfmadd213ps_avx512vl(auVar254,auVar130,auVar58);
                  auVar59._8_4_ = 0x3f321004;
                  auVar59._0_8_ = 0x3f3210043f321004;
                  auVar59._12_4_ = 0x3f321004;
                  auVar132 = vfmadd213ps_avx512vl(auVar132,auVar130,auVar59);
                  auVar60._8_4_ = 0x3f800000;
                  auVar60._0_8_ = 0x3f8000003f800000;
                  auVar60._12_4_ = 0x3f800000;
                  auVar130 = vfmadd213ps_avx512vl(auVar132,auVar130,auVar60);
                  auVar155 = vpsrld_avx(auVar130,0x17);
                  auVar280._8_4_ = 0xffffff81;
                  auVar280._0_8_ = 0xffffff81ffffff81;
                  auVar280._12_4_ = 0xffffff81;
                  auVar132 = vpaddd_avx(auVar209,auVar280);
                  auVar132 = vpaddd_avx(auVar132,auVar155);
                  uVar111 = vpcmpgtd_avx512vl(auVar132,auVar280);
                  uVar111 = uVar111 & 0xf;
                  auVar61._8_4_ = 0x7f;
                  auVar61._0_8_ = 0x7f0000007f;
                  auVar61._12_4_ = 0x7f;
                  uVar126 = vpcmpgtd_avx512vl(auVar132,auVar61);
                  uVar126 = uVar126 & 0xf;
                  auVar62._8_4_ = 0x807fffff;
                  auVar62._0_8_ = 0x807fffff807fffff;
                  auVar62._12_4_ = 0x807fffff;
                  auVar130 = vpandd_avx512vl(auVar130,auVar62);
                  auVar132 = vpslld_avx(auVar132,0x17);
                  auVar63._8_4_ = 0x3f800000;
                  auVar63._0_8_ = 0x3f8000003f800000;
                  auVar63._12_4_ = 0x3f800000;
                  auVar132 = vpaddd_avx512vl(auVar132,auVar63);
                  auVar132 = vpord_avx512vl(auVar132,auVar130);
                  auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar124 = (bool)((byte)uVar126 & 1);
                  in_ZmmResult._0_4_ =
                       (float)((uint)bVar124 * auVar130._0_4_ |
                              (uint)!bVar124 * (uint)((byte)uVar111 & 1) * auVar132._0_4_);
                  bVar124 = (bool)((byte)(uVar126 >> 1) & 1);
                  in_ZmmResult._4_4_ =
                       (float)((uint)bVar124 * auVar130._4_4_ |
                              (uint)!bVar124 * (uint)((byte)(uVar111 >> 1) & 1) * auVar132._4_4_);
                  bVar124 = (bool)((byte)(uVar126 >> 2) & 1);
                  in_ZmmResult._8_4_ =
                       (float)((uint)bVar124 * auVar130._8_4_ |
                              (uint)!bVar124 * (uint)((byte)(uVar111 >> 2) & 1) * auVar132._8_4_);
                  bVar124 = SUB81(uVar126 >> 3,0);
                  in_ZmmResult._12_4_ =
                       (float)((uint)bVar124 * auVar130._12_4_ |
                              (uint)!bVar124 * (uint)(byte)(uVar111 >> 3) * auVar132._12_4_);
                  local_5e8._4_4_ = in_ZmmResult._4_4_ * (float)local_5e8._4_4_;
                  local_5e8._0_4_ = in_ZmmResult._0_4_ * (float)local_5e8._0_4_;
                  fStack_5e0 = in_ZmmResult._8_4_ * fStack_5e0;
                  fStack_5dc = in_ZmmResult._12_4_ * fStack_5dc;
LAB_00405da7:
                  cVar125 = '\b';
                  if ((local_59c[iVar113] <= local_568) &&
                     (iVar114 = local_574[iVar113],
                     local_574[iVar113] = iVar114 + aiStack_498[iVar113],
                     iVar114 + aiStack_498[iVar113] != aiStack_3e4[iVar113])) {
                    local_59c[iVar113] = local_59c[iVar113] + afStack_48c[iVar113];
                    cVar125 = '\0';
                    auVar128 = auVar131;
                  }
                }
                auVar131 = auVar304._0_16_;
              } while (cVar125 == '\0');
              this_00 = local_408;
              ray = local_400;
              sampler = local_3f8;
              auVar134 = local_148;
              if (cVar125 == '\b') {
                auVar134 = _local_5e8;
              }
            }
            auVar132 = vshufpd_avx(auVar134,auVar134,1);
            local_148 = auVar134;
          }
          else {
            local_4c0._0_8_ = vmovlps_avx(auVar128);
            local_480.terminated = &local_611;
            local_480.beta = &local_4e8;
            local_480.vertex = local_550;
            local_480.pdfFwd = &local_5ec;
            local_480.prev = local_500;
            local_480.bounces = &local_60c;
            local_480.maxDepth = &maxDepth;
            local_480.anyNonSpecularBounces = &local_612;
            local_480.scattered = &local_613;
            local_610 = (float)local_608._0_4_;
            local_588 = (undefined8 *)(TVar6.bits & 0xffffffffffff);
            local_4c0._8_4_ = fVar193;
            local_4a0.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                     )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )TVar6.bits;
            Transform::ApplyInverse
                      ((Ray *)local_5d8,(Transform *)(local_588 + 0xf),(Ray *)local_4c0,&local_610);
            auVar155._0_4_ = afStack_5cc[1] * afStack_5cc[1];
            auVar155._4_4_ = afStack_5cc[2] * afStack_5cc[2];
            auVar155._8_8_ = 0;
            auVar131 = vmovshdup_avx(auVar155);
            fVar193 = afStack_5cc[0] * afStack_5cc[0] + auVar155._0_4_ + auVar131._0_4_;
            if (fVar193 < 0.0) {
              fVar193 = sqrtf(fVar193);
            }
            else {
              auVar131 = vsqrtss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193));
              fVar193 = auVar131._0_4_;
            }
            local_610 = fVar193 * local_610;
            auVar251._0_4_ = afStack_5cc[1] * afStack_5cc[1];
            auVar251._4_4_ = afStack_5cc[2] * afStack_5cc[2];
            auVar251._8_8_ = 0;
            auVar131 = vmovshdup_avx(auVar251);
            fVar193 = afStack_5cc[0] * afStack_5cc[0] + auVar251._0_4_ + auVar131._0_4_;
            if (fVar193 < 0.0) {
              fVar193 = sqrtf(fVar193);
            }
            else {
              auVar131 = vsqrtss_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193));
              fVar193 = auVar131._0_4_;
            }
            auVar131._8_4_ = 0x80000000;
            auVar131._0_8_ = 0x8000000080000000;
            auVar131._12_4_ = 0x80000000;
            auVar256._4_4_ = afStack_5cc[1];
            auVar256._0_4_ = afStack_5cc[0];
            auVar256._8_8_ = 0;
            auVar133._4_4_ = fVar193;
            auVar133._0_4_ = fVar193;
            auVar133._8_4_ = fVar193;
            auVar133._12_4_ = fVar193;
            auVar132 = vdivps_avx(auVar256,auVar133);
            uVar189 = vmovlps_avx(auVar132);
            afStack_5cc[0] = (float)uVar189;
            afStack_5cc[1] = (float)((ulong)uVar189 >> 0x20);
            afStack_5cc[2] = afStack_5cc[2] / fVar193;
            local_568 = local_610;
            auVar132 = ZEXT816(0) << 0x40;
            bVar124 = false;
            uVar118 = 0;
            do {
              pfVar119 = afStack_5cc;
              if ((uVar118 != 0) && (pfVar119 = afStack_5cc + 1, uVar118 != 1)) {
                pfVar119 = afStack_5cc + 2;
              }
              pfVar115 = (float *)(local_588 + 1);
              if ((uVar118 != 0) && (pfVar115 = (float *)((long)local_588 + 0xc), uVar118 != 1)) {
                pfVar115 = (float *)(local_588 + 2);
              }
              pfVar120 = (float *)local_5d8;
              if ((uVar118 != 0) && (pfVar120 = (float *)(local_5d8 + 4), uVar118 != 1)) {
                pfVar120 = &fStack_5d0;
              }
              pfVar121 = (float *)((long)local_588 + 0x14);
              if ((uVar118 != 0) && (pfVar121 = (float *)(local_588 + 3), uVar118 != 1)) {
                pfVar121 = (float *)((long)local_588 + 0x1c);
              }
              pfVar122 = (float *)local_5d8;
              if ((uVar118 != 0) && (pfVar122 = (float *)(local_5d8 + 4), uVar118 != 1)) {
                pfVar122 = &fStack_5d0;
              }
              auVar130 = ZEXT416((uint)((1.0 / *pfVar119) * (*pfVar121 - *pfVar122)));
              auVar155 = ZEXT416((uint)((1.0 / *pfVar119) * (*pfVar115 - *pfVar120)));
              auVar128 = vminss_avx(auVar130,auVar155);
              auVar132 = vmaxss_avx(auVar128,auVar132);
              auVar128 = vmaxss_avx(auVar155,auVar130);
              auVar128 = vminss_avx(ZEXT416((uint)(auVar128._0_4_ * 1.0000004)),
                                    ZEXT416((uint)local_568));
              auVar243 = ZEXT856(auVar128._8_8_);
              local_568 = auVar128._0_4_;
              if (auVar128._0_4_ < auVar132._0_4_) break;
              bVar124 = 1 < uVar118;
              uVar118 = uVar118 + 1;
            } while (uVar118 != 3);
            auVar134._8_4_ = 0x3f800000;
            auVar134._0_8_ = 0x3f8000003f800000;
            auVar134._12_4_ = 0x3f800000;
            if (bVar124) {
              local_5e8._0_4_ = auVar132._0_4_;
              uVar189 = 0;
              _local_608 = ZEXT416(*(uint *)(local_588 + 0xe));
              SVar325 = DenselySampledSpectrum::Sample
                                  ((DenselySampledSpectrum *)(local_588 + 4),lambda);
              auVar299._0_8_ = SVar325.values.values._8_8_;
              auVar299._8_56_ = auVar243;
              uStack_530 = uVar189;
              local_538 = (undefined1  [8])SVar325.values.values._0_8_;
              _local_548 = auVar299._0_16_;
              auVar191 = (undefined1  [56])0x0;
              _local_528 = ZEXT416(*(uint *)(local_588 + 0xe));
              SVar325 = DenselySampledSpectrum::Sample
                                  ((DenselySampledSpectrum *)(local_588 + 9),lambda);
              auVar234._0_8_ = SVar325.values.values._8_8_;
              auVar234._8_56_ = auVar243;
              auVar318._0_8_ = SVar325.values.values._0_8_;
              auVar318._8_56_ = auVar191;
              auVar131 = vunpcklpd_avx(_local_538,_local_548);
              local_358 = (float)local_608._0_4_ * auVar131._0_4_;
              fStack_354 = (float)local_608._0_4_ * auVar131._4_4_;
              fStack_350 = (float)local_608._0_4_ * auVar131._8_4_;
              fStack_34c = (float)local_608._0_4_ * auVar131._12_4_;
              auVar131 = vmovlhps_avx(auVar318._0_16_,auVar234._0_16_);
              local_368 = (float)local_528._0_4_ * auVar131._0_4_;
              fStack_364 = (float)local_528._0_4_ * auVar131._4_4_;
              fStack_360 = (float)local_528._0_4_ * auVar131._8_4_;
              fStack_35c = (float)local_528._0_4_ * auVar131._12_4_;
              local_178._0_4_ = local_368 + local_358;
              local_178._4_4_ = fStack_364 + fStack_354;
              local_178._8_4_ = fStack_360 + fStack_350;
              local_178._12_4_ = fStack_35c + fStack_34c;
              auVar318 = ZEXT1664(local_178);
              fVar193 = *(float *)(local_588 + 2);
              fVar245 = *(float *)((long)local_588 + 0x1c) - fVar193;
              uVar189 = vcmpss_avx512f(ZEXT416((uint)fVar193),
                                       ZEXT416((uint)*(float *)((long)local_588 + 0x1c)),1);
              bVar11 = (bool)((byte)uVar189 & 1);
              auVar165._8_8_ = 0;
              auVar165._0_8_ = local_588[1];
              auVar214._8_8_ = 0;
              auVar214._0_8_ = *(ulong *)((long)local_588 + 0x14);
              auVar131 = vsubps_avx(auVar214,auVar165);
              auVar302._4_4_ = local_5d8._4_4_;
              auVar302._0_4_ = local_5d8._0_4_;
              auVar302._8_8_ = 0;
              auVar132 = vsubps_avx(auVar302,auVar165);
              uVar111 = vcmpps_avx512vl(auVar165,auVar214,1);
              auVar128 = vdivps_avx512vl(auVar132,auVar131);
              bVar124 = (bool)((byte)uVar111 & 1);
              auVar136._0_4_ =
                   (float)((uint)bVar124 * auVar128._0_4_ | (uint)!bVar124 * auVar132._0_4_);
              bVar124 = (bool)((byte)(uVar111 >> 1) & 1);
              auVar136._4_4_ = (uint)bVar124 * auVar128._4_4_ | (uint)!bVar124 * auVar132._4_4_;
              bVar124 = (bool)((byte)(uVar111 >> 2) & 1);
              auVar136._8_4_ = (uint)bVar124 * auVar128._8_4_ | (uint)!bVar124 * auVar132._8_4_;
              bVar124 = (bool)((byte)(uVar111 >> 3) & 1);
              auVar136._12_4_ = (uint)bVar124 * auVar128._12_4_ | (uint)!bVar124 * auVar132._12_4_;
              in_ZmmResult._0_16_ = auVar136;
              auVar132 = vmovshdup_avx(auVar136);
              auVar166._4_4_ = afStack_5cc[1];
              auVar166._0_4_ = afStack_5cc[0];
              auVar166._8_8_ = 0;
              auVar131 = vdivps_avx(auVar166,auVar131);
              local_504 = afStack_5cc[2] / fVar245;
              local_590 = vmovlps_avx(auVar131);
              uVar189 = local_590;
              auVar314 = ZEXT464((uint)local_5e8._0_4_);
              local_590._4_4_ = (float)((ulong)local_590 >> 0x20);
              fVar239 = (float)local_5e8._0_4_ * (float)local_590 + auVar136._0_4_;
              fVar241 = (float)local_5e8._0_4_ * local_590._4_4_ + auVar132._0_4_;
              fVar193 = (float)((uint)bVar11 * (int)((fStack_5d0 - fVar193) / fVar245) +
                               (uint)!bVar11 * (int)(fStack_5d0 - fVar193)) +
                        (float)local_5e8._0_4_ * local_504;
              piVar1 = (int *)(local_588 + 0x23);
              piVar2 = (int *)((long)local_588 + 0x11c);
              piVar109 = (int *)(local_588 + 0x24);
              lVar110 = 0;
              auVar304 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              pfVar119 = (float *)((long)&local_590 + 4);
              local_590 = uVar189;
              do {
                iVar113 = (int)lVar110;
                fVar245 = fVar239;
                if ((iVar113 != 0) && (fVar245 = fVar241, iVar113 != 1)) {
                  fVar245 = fVar193;
                }
                piVar116 = piVar1;
                if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                  piVar116 = piVar109;
                }
                piVar117 = piVar1;
                if ((iVar113 != 0) && (piVar117 = piVar2, iVar113 != 1)) {
                  piVar117 = piVar109;
                }
                auVar294._0_4_ = (float)(*piVar117 + -1);
                auVar294._4_12_ = in_ZMM10._4_12_;
                auVar131 = vminss_avx(auVar294,ZEXT416((uint)(fVar245 * (float)*piVar116)));
                uVar189 = vcmpss_avx512f(ZEXT416((uint)(fVar245 * (float)*piVar116)),
                                         ZEXT816(0) << 0x40,1);
                auVar145._16_48_ = in_ZmmResult._16_48_;
                auVar145._0_16_ = auVar131;
                fVar245 = (float)((uint)!(bool)((byte)uVar189 & 1) * auVar131._0_4_);
                in_ZmmResult._4_60_ = auVar145._4_60_;
                in_ZmmResult._0_4_ = fVar245;
                iVar114 = (int)fVar245;
                local_574[lVar110] = iVar114;
                pfVar115 = (float *)&local_590;
                if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                  pfVar115 = &local_504;
                }
                if ((*pfVar115 == 0.0) && (!NAN(*pfVar115))) {
                  pfVar115 = (float *)&local_590;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_504;
                  }
                  *pfVar115 = 0.0;
                }
                pfVar115 = (float *)&local_590;
                if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                  pfVar115 = &local_504;
                }
                if (0.0 <= *pfVar115) {
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  fVar245 = fVar239;
                  if ((iVar113 != 0) && (fVar245 = fVar241, iVar113 != 1)) {
                    fVar245 = fVar193;
                  }
                  pfVar115 = (float *)&local_590;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_504;
                  }
                  local_59c[lVar110] =
                       (float)local_5e8._0_4_ +
                       ((float)(iVar114 + 1) / (float)*piVar116 - fVar245) / *pfVar115;
                  pfVar115 = (float *)&local_590;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_504;
                  }
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  afStack_48c[lVar110] = 1.0 / ((float)*piVar116 * *pfVar115);
                  aiStack_498[lVar110] = 1;
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  iVar113 = *piVar116;
                }
                else {
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  fVar245 = fVar239;
                  if ((iVar113 != 0) && (fVar245 = fVar241, iVar113 != 1)) {
                    fVar245 = fVar193;
                  }
                  pfVar115 = (float *)&local_590;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_504;
                  }
                  local_59c[lVar110] =
                       (float)local_5e8._0_4_ +
                       ((float)iVar114 / (float)*piVar116 - fVar245) / *pfVar115;
                  pfVar115 = (float *)&local_590;
                  if ((iVar113 != 0) && (pfVar115 = pfVar119, iVar113 != 1)) {
                    pfVar115 = &local_504;
                  }
                  piVar116 = piVar1;
                  if ((iVar113 != 0) && (piVar116 = piVar2, iVar113 != 1)) {
                    piVar116 = piVar109;
                  }
                  afStack_48c[lVar110] = -1.0 / ((float)*piVar116 * *pfVar115);
                  aiStack_498[lVar110] = -1;
                  iVar113 = -1;
                }
                aiStack_3e4[lVar110] = iVar113;
                lVar110 = lVar110 + 1;
              } while (lVar110 != 3);
              local_378._0_8_ = (ulong)local_588 | 0x4000000000000;
              local_388._0_8_ = (long)local_588 + 0x74U | 0x1000000000000;
              fStack_600 = 1.0;
              local_608 = (undefined1  [8])0x3f8000003f800000;
              fStack_5fc = 1.0;
              auVar299 = ZEXT464((uint)local_518._0_4_);
              puVar112 = local_588;
              do {
                auVar132 = auVar314._0_16_;
                iVar113 = *(int *)(&DAT_005841e0 +
                                  (ulong)((uint)(local_59c[1] < local_59c[2]) |
                                         (uint)(local_59c[0] < local_59c[1]) * 4 +
                                         (uint)(local_59c[0] < local_59c[2]) * 2) * 4);
                uVar273 = *(undefined4 *)
                           (puVar112[0x20] +
                           (((long)local_574[2] * (long)*(int *)((long)puVar112 + 0x11c) +
                            (long)local_574[1]) * (long)*(int *)(puVar112 + 0x23) +
                           (long)local_574[0]) * 4);
                auVar78._4_4_ = uVar273;
                auVar78._0_4_ = uVar273;
                auVar78._8_4_ = uVar273;
                auVar78._12_4_ = uVar273;
                in_ZmmResult._0_16_ = vmulps_avx512vl(auVar318._0_16_,auVar78);
                auVar131 = vminss_avx(ZEXT416((uint)local_59c[iVar113]),ZEXT416((uint)local_568));
                fVar150 = in_ZmmResult._0_4_;
                fVar193 = (float)((uint)fVar150 ^ auVar304._0_4_);
                fVar239 = (float)(in_ZmmResult._4_4_ ^ auVar304._4_4_);
                fVar241 = (float)(in_ZmmResult._8_4_ ^ auVar304._8_4_);
                fVar245 = (float)(in_ZmmResult._12_4_ ^ auVar304._12_4_);
                if ((fVar150 != 0.0) || (NAN(fVar150))) {
                  local_528._4_4_ = fVar239;
                  local_528._0_4_ = fVar193;
                  fStack_520 = fVar241;
                  fStack_51c = fVar245;
                  local_548._0_4_ = auVar131._0_4_;
                  local_5e8._0_4_ = auVar314._0_4_;
                  _local_538 = in_ZmmResult._0_16_;
                  do {
                    fVar193 = logf(1.0 - auVar299._0_4_);
                    fVar193 = (float)local_5e8._0_4_ - fVar193 / (float)local_538._0_4_;
                    uVar118 = (uint)(uVar123 >> 0x2d) ^ (uint)(uVar123 >> 0x1b);
                    bVar108 = (byte)(uVar123 >> 0x3b);
                    auVar131 = vcvtusi2ss_avx512f(in_XMM14,uVar118 >> bVar108 |
                                                           uVar118 << 0x20 - bVar108);
                    auVar131 = vminss_avx(ZEXT416((uint)(auVar131._0_4_ * 2.3283064e-10)),
                                          ZEXT416(0x3f7fffff));
                    auVar299 = ZEXT1664(auVar131);
                    if ((float)local_548._0_4_ <= fVar193) {
                      fVar193 = (float)local_548._0_4_ - (float)local_5e8._0_4_;
                      auVar169._0_4_ = fVar193 * (float)local_528._0_4_;
                      auVar169._4_4_ = fVar193 * (float)local_528._4_4_;
                      auVar169._8_4_ = fVar193 * fStack_520;
                      auVar169._12_4_ = fVar193 * fStack_51c;
                      auVar93._8_4_ = 0x3fb8aa3b;
                      auVar93._0_8_ = 0x3fb8aa3b3fb8aa3b;
                      auVar93._12_4_ = 0x3fb8aa3b;
                      auVar132 = vmulps_avx512vl(auVar169,auVar93);
                      auVar131 = vroundps_avx(auVar132,9);
                      auVar132 = vsubps_avx(auVar132,auVar131);
                      auVar219._0_4_ = (int)auVar131._0_4_;
                      auVar219._4_4_ = (int)auVar131._4_4_;
                      auVar219._8_4_ = (int)auVar131._8_4_;
                      auVar219._12_4_ = (int)auVar131._12_4_;
                      auVar259._8_4_ = 0x3da00ac9;
                      auVar259._0_8_ = 0x3da00ac93da00ac9;
                      auVar259._12_4_ = 0x3da00ac9;
                      auVar94._8_4_ = 0x3e679a0b;
                      auVar94._0_8_ = 0x3e679a0b3e679a0b;
                      auVar94._12_4_ = 0x3e679a0b;
                      auVar131 = vfmadd213ps_avx512vl(auVar259,auVar132,auVar94);
                      auVar95._8_4_ = 0x3f321004;
                      auVar95._0_8_ = 0x3f3210043f321004;
                      auVar95._12_4_ = 0x3f321004;
                      auVar131 = vfmadd213ps_avx512vl(auVar131,auVar132,auVar95);
                      auVar96._8_4_ = 0x3f800000;
                      auVar96._0_8_ = 0x3f8000003f800000;
                      auVar96._12_4_ = 0x3f800000;
                      auVar132 = vfmadd213ps_avx512vl(auVar131,auVar132,auVar96);
                      auVar128 = vpsrld_avx(auVar132,0x17);
                      auVar285._8_4_ = 0xffffff81;
                      auVar285._0_8_ = 0xffffff81ffffff81;
                      auVar285._12_4_ = 0xffffff81;
                      auVar131 = vpaddd_avx(auVar219,auVar285);
                      auVar131 = vpaddd_avx(auVar131,auVar128);
                      uVar111 = vpcmpgtd_avx512vl(auVar131,auVar285);
                      uVar111 = uVar111 & 0xf;
                      auVar97._8_4_ = 0x7f;
                      auVar97._0_8_ = 0x7f0000007f;
                      auVar97._12_4_ = 0x7f;
                      uVar126 = vpcmpgtd_avx512vl(auVar131,auVar97);
                      uVar126 = uVar126 & 0xf;
                      auVar98._8_4_ = 0x807fffff;
                      auVar98._0_8_ = 0x807fffff807fffff;
                      auVar98._12_4_ = 0x807fffff;
                      auVar132 = vpandd_avx512vl(auVar132,auVar98);
                      auVar131 = vpslld_avx(auVar131,0x17);
                      auVar99._8_4_ = 0x3f800000;
                      auVar99._0_8_ = 0x3f8000003f800000;
                      auVar99._12_4_ = 0x3f800000;
                      auVar131 = vpaddd_avx512vl(auVar131,auVar99);
                      auVar131 = vpord_avx512vl(auVar131,auVar132);
                      auVar132 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                      bVar124 = (bool)((byte)uVar126 & 1);
                      in_ZmmResult._0_4_ =
                           (float)((uint)bVar124 * auVar132._0_4_ |
                                  (uint)!bVar124 * (uint)((byte)uVar111 & 1) * auVar131._0_4_);
                      bVar124 = (bool)((byte)(uVar126 >> 1) & 1);
                      in_ZmmResult._4_4_ =
                           (float)((uint)bVar124 * auVar132._4_4_ |
                                  (uint)!bVar124 * (uint)((byte)(uVar111 >> 1) & 1) * auVar131._4_4_
                                  );
                      bVar124 = (bool)((byte)(uVar126 >> 2) & 1);
                      in_ZmmResult._8_4_ =
                           (float)((uint)bVar124 * auVar132._8_4_ |
                                  (uint)!bVar124 * (uint)((byte)(uVar111 >> 2) & 1) * auVar131._8_4_
                                  );
                      bVar124 = SUB81(uVar126 >> 3,0);
                      in_ZmmResult._12_4_ =
                           (float)((uint)bVar124 * auVar132._12_4_ |
                                  (uint)!bVar124 * (uint)(byte)(uVar111 >> 3) * auVar131._12_4_);
                      local_608._4_4_ = in_ZmmResult._4_4_ * (float)local_608._4_4_;
                      local_608._0_4_ = in_ZmmResult._0_4_ * (float)local_608._0_4_;
                      fStack_600 = in_ZmmResult._8_4_ * fStack_600;
                      fStack_5fc = in_ZmmResult._12_4_ * fStack_5fc;
                      cVar125 = '\n';
                    }
                    else {
                      cVar125 = '\0';
                      if (local_568 <= fVar193) {
                        local_5e8._0_4_ = fVar193;
                      }
                      else {
                        local_518._0_4_ = auVar131._0_4_;
                        fVar239 = fVar193 - (float)local_5e8._0_4_;
                        auVar168._0_4_ = fVar239 * (float)local_528._0_4_;
                        auVar168._4_4_ = fVar239 * (float)local_528._4_4_;
                        auVar168._8_4_ = fVar239 * fStack_520;
                        auVar168._12_4_ = fVar239 * fStack_51c;
                        auVar86._8_4_ = 0x3fb8aa3b;
                        auVar86._0_8_ = 0x3fb8aa3b3fb8aa3b;
                        auVar86._12_4_ = 0x3fb8aa3b;
                        auVar131 = vmulps_avx512vl(auVar168,auVar86);
                        _local_428 = vroundps_avx(auVar131,9);
                        auVar131 = vsubps_avx(auVar131,_local_428);
                        auVar216._8_4_ = 0x3da00ac9;
                        auVar216._0_8_ = 0x3da00ac93da00ac9;
                        auVar216._12_4_ = 0x3da00ac9;
                        auVar87._8_4_ = 0x3e679a0b;
                        auVar87._0_8_ = 0x3e679a0b3e679a0b;
                        auVar87._12_4_ = 0x3e679a0b;
                        auVar132 = vfmadd213ps_avx512vl(auVar216,auVar131,auVar87);
                        auVar88._8_4_ = 0x3f321004;
                        auVar88._0_8_ = 0x3f3210043f321004;
                        auVar88._12_4_ = 0x3f321004;
                        auVar132 = vfmadd213ps_avx512vl(auVar132,auVar131,auVar88);
                        auVar89._8_4_ = 0x3f800000;
                        auVar89._0_8_ = 0x3f8000003f800000;
                        auVar89._12_4_ = 0x3f800000;
                        local_418 = vfmadd213ps_avx512vl(auVar132,auVar131,auVar89);
                        local_348 = ZEXT416((uint)fVar193);
                        auVar217._0_4_ = fVar193 * afStack_5cc[0] + (float)local_5d8._0_4_;
                        auVar217._4_4_ = fVar193 * afStack_5cc[1] + (float)local_5d8._4_4_;
                        auVar217._8_4_ = fVar193 * 0.0 + 0.0;
                        auVar217._12_4_ = fVar193 * 0.0 + 0.0;
                        auVar191 = ZEXT856(auVar217._8_8_);
                        local_580.super_Tuple3<pbrt::Point3,_float>.z =
                             fVar193 * afStack_5cc[2] + fStack_5d0;
                        auVar243 = (undefined1  [56])0x0;
                        uVar189 = vmovlps_avx(auVar217);
                        local_580.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar189;
                        local_580.super_Tuple3<pbrt::Point3,_float>.y =
                             (float)((ulong)uVar189 >> 0x20);
                        SVar325 = NanoVDBMediumProvider::Density
                                            ((NanoVDBMediumProvider *)*puVar112,&local_580,lambda);
                        auVar235._0_8_ = SVar325.values.values._8_8_;
                        auVar235._8_56_ = auVar191;
                        auVar185._0_8_ = SVar325.values.values._0_8_;
                        auVar185._8_56_ = auVar243;
                        local_4d8 = auVar185._0_16_;
                        local_4f8 = auVar235._0_16_;
                        SVar325 = NanoVDBMediumProvider::Le
                                            ((NanoVDBMediumProvider *)*puVar112,&local_580,lambda);
                        auVar236._0_8_ = SVar325.values.values._8_8_;
                        auVar236._8_56_ = auVar191;
                        auVar186._0_8_ = SVar325.values.values._0_8_;
                        auVar186._8_56_ = auVar243;
                        auVar131 = vfmadd231ss_fma(ZEXT416((uint)(local_580.
                                                                  super_Tuple3<pbrt::Point3,_float>.
                                                                  y * *(float *)((long)puVar112 +
                                                                                0x7c))),
                                                   ZEXT416((uint)local_580.
                                                                 super_Tuple3<pbrt::Point3,_float>.x
                                                          ),ZEXT416(*(uint *)(puVar112 + 0xf)));
                        auVar131 = vfmadd231ss_fma(auVar131,ZEXT416((uint)local_580.
                                                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar112 + 0x10)));
                        fVar193 = auVar131._0_4_ + *(float *)((long)puVar112 + 0x84);
                        auVar131 = vfmadd231ss_fma(ZEXT416((uint)(local_580.
                                                                  super_Tuple3<pbrt::Point3,_float>.
                                                                  y * *(float *)((long)puVar112 +
                                                                                0x8c))),
                                                   ZEXT416((uint)local_580.
                                                                 super_Tuple3<pbrt::Point3,_float>.x
                                                          ),ZEXT416(*(uint *)(puVar112 + 0x11)));
                        auVar131 = vfmadd231ss_fma(auVar131,ZEXT416((uint)local_580.
                                                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar112 + 0x12)));
                        fVar239 = auVar131._0_4_ + *(float *)((long)puVar112 + 0x94);
                        auVar131 = vfmadd231ss_fma(ZEXT416((uint)(local_580.
                                                                  super_Tuple3<pbrt::Point3,_float>.
                                                                  y * *(float *)((long)puVar112 +
                                                                                0x9c))),
                                                   ZEXT416((uint)local_580.
                                                                 super_Tuple3<pbrt::Point3,_float>.x
                                                          ),ZEXT416(*(uint *)(puVar112 + 0x13)));
                        auVar131 = vfmadd231ss_fma(auVar131,ZEXT416((uint)local_580.
                                                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar112 + 0x14)));
                        auVar132 = vfmadd231ss_fma(ZEXT416((uint)(local_580.
                                                                  super_Tuple3<pbrt::Point3,_float>.
                                                                  y * *(float *)((long)puVar112 +
                                                                                0xac))),
                                                   ZEXT416((uint)local_580.
                                                                 super_Tuple3<pbrt::Point3,_float>.x
                                                          ),ZEXT416(*(uint *)(puVar112 + 0x15)));
                        auVar132 = vfmadd231ss_fma(auVar132,ZEXT416((uint)local_580.
                                                                                                                                                    
                                                  super_Tuple3<pbrt::Point3,_float>.z),
                                                  ZEXT416(*(uint *)(puVar112 + 0x16)));
                        fVar241 = auVar132._0_4_ + *(float *)((long)puVar112 + 0xb4);
                        bVar124 = fVar241 == 1.0;
                        fVar245 = auVar131._0_4_ + *(float *)((long)puVar112 + 0xa4);
                        auVar218._0_4_ = local_4c0._16_4_ * local_4c0._16_4_;
                        auVar218._4_4_ = local_4c0._20_4_ * local_4c0._20_4_;
                        auVar218._8_8_ = 0;
                        auVar131 = vmovshdup_avx(auVar218);
                        fVar150 = (float)local_4c0._12_4_ * (float)local_4c0._12_4_ + auVar218._0_4_
                                  + auVar131._0_4_;
                        if (fVar150 < 0.0) {
                          local_3d8 = ZEXT416((uint)fVar193);
                          local_2f8 = ZEXT416((uint)fVar239);
                          local_308 = ZEXT416((uint)fVar245);
                          local_318._0_4_ = fVar241;
                          local_3a8 = auVar236._0_16_;
                          local_398 = auVar186._0_16_;
                          fVar150 = sqrtf(fVar150);
                          fVar241 = (float)local_318._0_4_;
                          auVar131 = local_398;
                          auVar132 = local_3a8;
                          auVar128 = local_3d8;
                          auVar130 = local_308;
                          fVar239 = (float)local_2f8._0_4_;
                        }
                        else {
                          auVar131 = vsqrtss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
                          fVar150 = auVar131._0_4_;
                          auVar131 = auVar186._0_16_;
                          auVar132 = auVar236._0_16_;
                          auVar128 = ZEXT416((uint)fVar193);
                          auVar130 = ZEXT416((uint)fVar245);
                        }
                        auVar256 = _local_538;
                        auVar220._0_4_ = (int)(float)local_428._0_4_;
                        auVar220._4_4_ = (int)(float)local_428._4_4_;
                        auVar220._8_4_ = (int)fStack_420;
                        auVar220._12_4_ = (int)fStack_41c;
                        auVar251 = vpsrld_avx(local_418,0x17);
                        auVar286._8_4_ = 0xffffff81;
                        auVar286._0_8_ = 0xffffff81ffffff81;
                        auVar286._12_4_ = 0xffffff81;
                        auVar155 = vpaddd_avx(auVar220,auVar286);
                        auVar155 = vpaddd_avx(auVar155,auVar251);
                        uVar111 = vpcmpgtd_avx512vl(auVar155,auVar286);
                        uVar111 = uVar111 & 0xf;
                        auVar90._8_4_ = 0x7f;
                        auVar90._0_8_ = 0x7f0000007f;
                        auVar90._12_4_ = 0x7f;
                        uVar126 = vpcmpgtd_avx512vl(auVar155,auVar90);
                        uVar126 = uVar126 & 0xf;
                        auVar91._8_4_ = 0x807fffff;
                        auVar91._0_8_ = 0x807fffff807fffff;
                        auVar91._12_4_ = 0x807fffff;
                        auVar251 = vpandd_avx512vl(local_418,auVar91);
                        auVar155 = vpslld_avx(auVar155,0x17);
                        auVar92._8_4_ = 0x3f800000;
                        auVar92._0_8_ = 0x3f8000003f800000;
                        auVar92._12_4_ = 0x3f800000;
                        auVar155 = vpaddd_avx512vl(auVar155,auVar92);
                        auVar133 = vpord_avx512vl(auVar155,auVar251);
                        auVar134 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                        bVar11 = (bool)((byte)uVar126 & 1);
                        bVar8 = (bool)((byte)(uVar126 >> 1) & 1);
                        bVar9 = (bool)((byte)(uVar126 >> 2) & 1);
                        bVar10 = SUB81(uVar126 >> 3,0);
                        auVar155 = vmovlhps_avx(local_4d8,local_4f8);
                        auVar287._0_4_ = auVar155._0_4_ * local_358;
                        auVar287._4_4_ = auVar155._4_4_ * fStack_354;
                        auVar287._8_4_ = auVar155._8_4_ * fStack_350;
                        auVar287._12_4_ = auVar155._12_4_ * fStack_34c;
                        auVar251 = vshufpd_avx(auVar287,auVar287,1);
                        auVar260._0_4_ = auVar155._0_4_ * local_368;
                        auVar260._4_4_ = auVar155._4_4_ * fStack_364;
                        auVar260._8_4_ = auVar155._8_4_ * fStack_360;
                        auVar260._12_4_ = auVar155._12_4_ * fStack_35c;
                        auVar155 = vshufpd_avx(auVar260,auVar260,1);
                        aStack_2b8.mi.sigma_maj.values.values[2] =
                             (float)((uint)bVar11 * auVar134._0_4_ |
                                    (uint)!bVar11 * (uint)((byte)uVar111 & 1) * auVar133._0_4_) *
                             (float)local_608._0_4_;
                        aStack_2b8.mi.sigma_maj.values.values[3] =
                             (float)((uint)bVar8 * auVar134._4_4_ |
                                    (uint)!bVar8 * (uint)((byte)(uVar111 >> 1) & 1) * auVar133._4_4_
                                    ) * (float)local_608._4_4_;
                        aStack_2b8.mi.Le.values.values[0] =
                             (float)((uint)bVar9 * auVar134._8_4_ |
                                    (uint)!bVar9 * (uint)((byte)(uVar111 >> 2) & 1) * auVar133._8_4_
                                    ) * fStack_600;
                        aStack_2b8.mi.Le.values.values[1] =
                             (float)((uint)bVar10 * auVar134._12_4_ |
                                    (uint)!bVar10 * (uint)(byte)(uVar111 >> 3) * auVar133._12_4_) *
                             fStack_5fc;
                        fVar193 = auVar128._0_4_ / fVar241;
                        auVar147._4_12_ = auVar128._4_12_;
                        auVar147._0_4_ = fVar193;
                        fVar245 = auVar130._0_4_ / fVar241;
                        auVar148._4_12_ = auVar130._4_12_;
                        auVar148._0_4_ = fVar245;
                        auVar147._16_48_ = in_ZmmResult._16_48_;
                        auVar146._4_60_ = auVar147._4_60_;
                        auVar146._0_4_ =
                             (uint)bVar124 * (int)auVar128._0_4_ + (uint)!bVar124 * (int)fVar193;
                        iVar114 = (uint)bVar124 * (int)fVar239 +
                                  (uint)!bVar124 * (int)(fVar239 / fVar241);
                        auVar148._16_48_ = in_ZmmResult._16_48_;
                        in_ZmmResult._4_60_ = auVar148._4_60_;
                        in_ZmmResult._0_4_ =
                             (float)((uint)bVar124 * (int)auVar130._0_4_ +
                                    (uint)!bVar124 * (int)fVar245);
                        auVar317._0_8_ = local_4c0._12_8_ ^ 0x8000000080000000;
                        auVar317._8_4_ = 0x80000000;
                        auVar317._12_4_ = 0x80000000;
                        auVar323._4_4_ = fVar150;
                        auVar323._0_4_ = fVar150;
                        auVar323._8_4_ = fVar150;
                        auVar323._12_4_ = fVar150;
                        auVar128 = vdivps_avx(auVar317,auVar323);
                        auVar324._0_4_ = -fStack_4ac;
                        auVar324._4_4_ = 0x80000000;
                        auVar324._8_4_ = 0x80000000;
                        auVar324._12_4_ = 0x80000000;
                        auVar170._0_4_ = auVar324._0_4_ / fVar150;
                        auVar170._4_12_ = auVar324._4_12_;
                        aStack_2b8._96_8_ = local_538;
                        aStack_2b8.mi.sigma_s.values.values[0] = (float)uStack_530;
                        aStack_2b8.mi.sigma_s.values.values[1] = uStack_530._4_4_;
                        auVar307._4_4_ = iVar114;
                        auVar307._0_4_ = iVar114;
                        auVar307._8_4_ = iVar114;
                        auVar307._12_4_ = iVar114;
                        auVar312._4_4_ = in_ZmmResult._0_4_;
                        auVar312._0_4_ = in_ZmmResult._0_4_;
                        auVar312._8_4_ = in_ZmmResult._0_4_;
                        auVar312._12_4_ = in_ZmmResult._0_4_;
                        aStack_2b8._16_16_ = ZEXT816(0);
                        aStack_2b8.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y =
                             0.0;
                        auVar130 = vshufps_avx(auVar146._0_16_,auVar307,0x40);
                        local_2d0._0_4_ = auVar130._0_4_;
                        local_2d0._4_4_ = auVar130._4_4_;
                        local_2d0._8_4_ = auVar130._8_4_;
                        local_2d0._12_4_ = auVar130._12_4_;
                        uVar189 = vmovlps_avx(auVar312);
                        local_2d0._16_4_ = (undefined4)uVar189;
                        local_2d0._20_4_ = (undefined4)((ulong)uVar189 >> 0x20);
                        aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = FStack_4a8;
                        uVar189 = vmovlps_avx(auVar128);
                        aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar189;
                        aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low =
                             (Float)((ulong)uVar189 >> 0x20);
                        aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0
                        ;
                        aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0
                        ;
                        aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                             local_378._0_4_;
                        aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                             local_378._4_4_;
                        aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                             local_388._0_4_;
                        aStack_2b8._60_4_ = local_388._4_4_;
                        auVar178._16_16_ = auVar155;
                        auVar178._0_16_ = auVar170;
                        auVar298._16_16_ = auVar251;
                        auVar298._0_16_ = auVar170;
                        auVar178 = vperm2f128_avx(auVar298,auVar178,0x31);
                        auVar268._16_16_ = auVar260;
                        auVar268._0_16_ = auVar287;
                        auVar178 = vunpcklpd_avx(auVar268,auVar178);
                        aStack_2b8._64_4_ = auVar178._0_4_;
                        aStack_2b8._68_4_ = auVar178._4_4_;
                        aStack_2b8.ei.super_Interaction.medium.
                        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                        .bits = auVar178._8_8_;
                        aStack_2b8.si.dpdu.super_Tuple3<pbrt::Vector3,_float> = auVar178._16_12_;
                        aStack_2b8.mi.sigma_a.values.values[1] = auVar178._28_4_;
                        auVar132 = vmovlhps_avx(auVar131,auVar132);
                        aStack_2b8._112_8_ = auVar132._0_8_;
                        aStack_2b8._120_8_ = auVar132._8_8_;
                        in_ZMM10 = ZEXT464((uint)FStack_4a8);
                        in_ZMM12 = ZEXT1664(auVar131);
                        _local_538 = auVar256;
                        aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = auVar170._0_4_;
                        bVar124 = RandomWalk::anon_class_88_11_14aa307c::operator()
                                            (&local_480,(MediumSample *)local_2d0);
                        cVar125 = !bVar124;
                        if ((bool)cVar125) {
                          local_158._8_4_ = 0x3f800000;
                          local_158._0_8_ = 0x3f8000003f800000;
                          local_158._12_4_ = 0x3f800000;
                        }
                        else {
                          local_5e8._0_4_ = local_348._0_4_;
                        }
                        fStack_600 = 1.0;
                        local_608 = (undefined1  [8])0x3f8000003f800000;
                        fStack_5fc = 1.0;
                        auVar299 = ZEXT464((uint)local_518._0_4_);
                        puVar112 = local_588;
                      }
                    }
                    uVar123 = uVar123 * 0x5851f42d4c957f2d + (long)local_3c8;
                  } while (cVar125 == '\0');
                  if (cVar125 == '\n') {
                    auVar304 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)
                                                 ));
                    auVar132 = ZEXT416((uint)local_5e8._0_4_);
                    auVar318 = ZEXT1664(local_178);
                    auVar131 = ZEXT416((uint)local_548._0_4_);
                    goto LAB_00406b87;
                  }
                  auVar132 = ZEXT416((uint)local_5e8._0_4_);
                  auVar304 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)))
                  ;
                  auVar318 = ZEXT1664(local_178);
                }
                else {
                  fVar150 = auVar131._0_4_ - auVar314._0_4_;
                  auVar167._0_4_ = fVar150 * fVar193;
                  auVar167._4_4_ = fVar150 * fVar239;
                  auVar167._8_4_ = fVar150 * fVar241;
                  auVar167._12_4_ = fVar150 * fVar245;
                  auVar79._8_4_ = 0x3fb8aa3b;
                  auVar79._0_8_ = 0x3fb8aa3b3fb8aa3b;
                  auVar79._12_4_ = 0x3fb8aa3b;
                  auVar130 = vmulps_avx512vl(auVar167,auVar79);
                  auVar128 = vroundps_avx(auVar130,9);
                  auVar130 = vsubps_avx(auVar130,auVar128);
                  auVar215._0_4_ = (int)auVar128._0_4_;
                  auVar215._4_4_ = (int)auVar128._4_4_;
                  auVar215._8_4_ = (int)auVar128._8_4_;
                  auVar215._12_4_ = (int)auVar128._12_4_;
                  auVar258._8_4_ = 0x3da00ac9;
                  auVar258._0_8_ = 0x3da00ac93da00ac9;
                  auVar258._12_4_ = 0x3da00ac9;
                  auVar80._8_4_ = 0x3e679a0b;
                  auVar80._0_8_ = 0x3e679a0b3e679a0b;
                  auVar80._12_4_ = 0x3e679a0b;
                  auVar128 = vfmadd213ps_avx512vl(auVar258,auVar130,auVar80);
                  auVar81._8_4_ = 0x3f321004;
                  auVar81._0_8_ = 0x3f3210043f321004;
                  auVar81._12_4_ = 0x3f321004;
                  auVar128 = vfmadd213ps_avx512vl(auVar128,auVar130,auVar81);
                  auVar82._8_4_ = 0x3f800000;
                  auVar82._0_8_ = 0x3f8000003f800000;
                  auVar82._12_4_ = 0x3f800000;
                  auVar130 = vfmadd213ps_avx512vl(auVar128,auVar130,auVar82);
                  auVar155 = vpsrld_avx(auVar130,0x17);
                  auVar284._8_4_ = 0xffffff81;
                  auVar284._0_8_ = 0xffffff81ffffff81;
                  auVar284._12_4_ = 0xffffff81;
                  auVar128 = vpaddd_avx(auVar215,auVar284);
                  auVar128 = vpaddd_avx(auVar128,auVar155);
                  uVar111 = vpcmpgtd_avx512vl(auVar128,auVar284);
                  uVar111 = uVar111 & 0xf;
                  auVar83._8_4_ = 0x7f;
                  auVar83._0_8_ = 0x7f0000007f;
                  auVar83._12_4_ = 0x7f;
                  uVar126 = vpcmpgtd_avx512vl(auVar128,auVar83);
                  uVar126 = uVar126 & 0xf;
                  auVar84._8_4_ = 0x807fffff;
                  auVar84._0_8_ = 0x807fffff807fffff;
                  auVar84._12_4_ = 0x807fffff;
                  auVar130 = vpandd_avx512vl(auVar130,auVar84);
                  auVar128 = vpslld_avx(auVar128,0x17);
                  auVar85._8_4_ = 0x3f800000;
                  auVar85._0_8_ = 0x3f8000003f800000;
                  auVar85._12_4_ = 0x3f800000;
                  auVar128 = vpaddd_avx512vl(auVar128,auVar85);
                  auVar128 = vpord_avx512vl(auVar128,auVar130);
                  auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  bVar124 = (bool)((byte)uVar126 & 1);
                  in_ZmmResult._0_4_ =
                       (float)((uint)bVar124 * auVar130._0_4_ |
                              (uint)!bVar124 * (uint)((byte)uVar111 & 1) * auVar128._0_4_);
                  bVar124 = (bool)((byte)(uVar126 >> 1) & 1);
                  in_ZmmResult._4_4_ =
                       (float)((uint)bVar124 * auVar130._4_4_ |
                              (uint)!bVar124 * (uint)((byte)(uVar111 >> 1) & 1) * auVar128._4_4_);
                  bVar124 = (bool)((byte)(uVar126 >> 2) & 1);
                  in_ZmmResult._8_4_ =
                       (float)((uint)bVar124 * auVar130._8_4_ |
                              (uint)!bVar124 * (uint)((byte)(uVar111 >> 2) & 1) * auVar128._8_4_);
                  bVar124 = SUB81(uVar126 >> 3,0);
                  in_ZmmResult._12_4_ =
                       (float)((uint)bVar124 * auVar130._12_4_ |
                              (uint)!bVar124 * (uint)(byte)(uVar111 >> 3) * auVar128._12_4_);
                  local_608._4_4_ = in_ZmmResult._4_4_ * (float)local_608._4_4_;
                  local_608._0_4_ = in_ZmmResult._0_4_ * (float)local_608._0_4_;
                  fStack_600 = in_ZmmResult._8_4_ * fStack_600;
                  fStack_5fc = in_ZmmResult._12_4_ * fStack_5fc;
LAB_00406b87:
                  cVar125 = '\b';
                  if ((local_59c[iVar113] <= local_568) &&
                     (iVar114 = local_574[iVar113],
                     local_574[iVar113] = iVar114 + aiStack_498[iVar113],
                     iVar114 + aiStack_498[iVar113] != aiStack_3e4[iVar113])) {
                    local_59c[iVar113] = local_59c[iVar113] + afStack_48c[iVar113];
                    cVar125 = '\0';
                    auVar132 = auVar131;
                  }
                }
                auVar131 = auVar304._0_16_;
                auVar314 = ZEXT1664(auVar132);
              } while (cVar125 == '\0');
              this_00 = local_408;
              ray = local_400;
              sampler = local_3f8;
              auVar134 = local_158;
              if (cVar125 == '\b') {
                auVar134 = _local_608;
              }
            }
            auVar132 = vshufpd_avx(auVar134,auVar134,1);
            local_158 = auVar134;
          }
        }
        uVar189 = aStack_2b8._48_8_;
        if (local_613 == false) {
          auVar132 = vunpcklpd_avx(auVar134,auVar132);
          auVar174._0_4_ = auVar134._0_4_;
          auVar174._4_4_ = auVar174._0_4_;
          auVar174._8_4_ = auVar174._0_4_;
          auVar174._12_4_ = auVar174._0_4_;
          auVar132 = vdivps_avx(auVar132,auVar174);
          local_4e8.values.values[1] = auVar132._4_4_ * local_4e8.values.values[1];
          local_4e8.values.values[0] = auVar132._0_4_ * local_4e8.values.values[0];
          local_4e8.values.values[2] = auVar132._8_4_ * local_4e8.values.values[2];
          local_4e8.values.values[3] = auVar132._12_4_ * local_4e8.values.values[3];
        }
      }
      aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
           (float)((ulong)uVar189 >> 0x20);
      aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)uVar189;
      if (local_611 == true) {
        iVar113 = 1;
        local_3e8 = local_60c;
      }
      else {
        iVar113 = 2;
        if (local_613 == false) {
          if ((byte)local_38 == '\0') {
            iVar113 = 3;
            if (mode == Radiance) {
              fVar193 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
              fVar239 = fVar193 + (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
              uVar123._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
              uVar123._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
              auVar262._8_8_ = 0;
              auVar262._0_8_ = uVar123;
              fVar241 = (float)(undefined4)uVar123 +
                        (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
              auVar132 = vmovshdup_avx(auVar262);
              fVar245 = auVar132._0_4_ + (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
              auVar263._0_4_ = (undefined4)uVar123 ^ auVar131._0_4_;
              auVar263._4_4_ = uVar123._4_4_ ^ auVar131._4_4_;
              auVar263._8_4_ = auVar131._8_4_;
              auVar263._12_4_ = auVar131._12_4_;
              FVar149 = (ray->super_Ray).time;
              uVar7 = (ray->super_Ray).medium.
                      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                      .bits;
              auVar291._4_4_ = fVar241;
              auVar291._0_4_ = fVar241;
              auVar291._8_4_ = fVar241;
              auVar291._12_4_ = fVar241;
              auVar295._4_4_ = fVar245;
              auVar295._0_4_ = fVar245;
              auVar295._8_4_ = fVar245;
              auVar295._12_4_ = fVar245;
              auVar132 = vmovlhps_avx(auVar291,auVar295);
              auVar224._4_4_ = fVar239;
              auVar224._0_4_ = fVar239;
              auVar224._8_4_ = fVar239;
              auVar224._12_4_ = fVar239;
              aStack_2b8.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
              aStack_2b8.mi.Le.values.values[0] = 0.0;
              aStack_2b8.mi.Le.values.values[1] = 0.0;
              aStack_2b8._144_8_ = 0;
              local_550->type = Light;
              *(undefined8 *)(local_550->beta).values.values = local_4e8.values.values._0_8_;
              *(undefined8 *)((local_550->beta).values.values + 2) = local_4e8.values.values._8_8_;
              *(undefined1 (*) [16])&local_550->field_2 = auVar132;
              IVar4 = (Interval)vmovlps_avx(auVar224);
              (local_550->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = IVar4;
              (local_550->field_2).ei.super_Interaction.time = FVar149;
              (((Interaction *)&local_550->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
              (((Interaction *)&local_550->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
              (local_550->field_2).ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z =
                   0.0;
              uVar242 = vmovlps_avx(auVar263);
              (((Interaction *)&local_550->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.x =
                   (float)(int)uVar242;
              (((Interaction *)&local_550->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.y =
                   (float)(int)((ulong)uVar242 >> 0x20);
              (local_550->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                   (float)((uint)fVar193 ^ auVar131._0_4_);
              (local_550->field_2).ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float> =
                   (Tuple2<pbrt::Point2,_float>)0x0;
              (local_550->field_2).ei.super_Interaction.mediumInterface = (MediumInterface *)0x0;
              (local_550->field_2).ei.super_Interaction.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = uVar7;
              (local_550->field_2).ei.field_0 =
                   (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)0x0;
              auVar106._4_4_ =
                   aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
              auVar106._0_4_ =
                   aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
              auVar106._8_4_ =
                   aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
              auVar106._12_4_ =
                   aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
              auVar106._16_4_ =
                   aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
              auVar106._20_4_ = aStack_2b8._60_4_;
              auVar106._24_4_ = aStack_2b8._64_4_;
              auVar106._28_4_ = aStack_2b8._68_4_;
              auVar106._32_8_ =
                   aStack_2b8.ei.super_Interaction.medium.
                   super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   .bits;
              auVar106._40_12_ =
                   (undefined1  [12])aStack_2b8.si.dpdu.super_Tuple3<pbrt::Vector3,_float>;
              auVar106._52_4_ = aStack_2b8.mi.sigma_a.values.values[1];
              auVar106._56_8_ = aStack_2b8._96_8_;
              in_ZmmResult = ZEXT4464(CONCAT440(aStack_2b8.mi.sigma_maj.values.values[3],
                                                CONCAT436(aStack_2b8.mi.sigma_maj.values.values[2],
                                                          CONCAT828(aStack_2b8._120_8_,
                                                                    CONCAT820(aStack_2b8._112_8_,
                                                                              CONCAT812(aStack_2b8.
                                                                                        _104_8_,
                                                  CONCAT84(aStack_2b8._96_8_,
                                                           aStack_2b8.mi.sigma_a.values.values[1])))
                                                  ))));
              *(ulong *)((long)&local_550->field_2 + 0x58) =
                   CONCAT44(local_2d0._4_4_,local_2d0._0_4_);
              *(ulong *)((long)&local_550->field_2 + 0x60) =
                   CONCAT44(local_2d0._12_4_,local_2d0._8_4_);
              *(ulong *)((long)&local_550->field_2 + 0x68) =
                   CONCAT44(local_2d0._20_4_,local_2d0._16_4_);
              *(ulong *)((long)&local_550->field_2 + 0x70) =
                   CONCAT44(aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                            aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low);
              *(ulong *)((long)&local_550->field_2 + 0x78) =
                   CONCAT44(aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high,
                            aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low);
              *(Interval *)((long)&local_550->field_2 + 0x80) =
                   aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
              *(undefined8 *)((long)&local_550->field_2 + 0x88) = aStack_2b8._24_8_;
              *(ulong *)((long)&local_550->field_2 + 0x90) =
                   CONCAT44(aStack_2b8.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z,
                            aStack_2b8.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y)
              ;
              *(undefined1 (*) [64])((long)&local_550->field_2 + 0x98) = auVar106;
              *(undefined1 (*) [64])((long)&local_550->field_2 + 0xcc) = in_ZmmResult;
              (local_550->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
              (local_550->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
              *(undefined8 *)&(local_550->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z
                   = 0;
              (local_550->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
              (local_550->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
              (local_550->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
              (local_550->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
              (local_550->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
              local_550->delta = false;
              local_550->pdfFwd = local_5ec;
              local_550->pdfRev = 0.0;
              local_60c = local_60c + 1;
            }
          }
          else {
            local_320.bits =
                 (local_2e0->
                 super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                 ).bits;
            local_328.bits =
                 (sampler->
                 super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            aStack_2b8._48_8_ = uVar189;
            SurfaceInteraction::GetBSDF
                      ((BSDF *)&local_480,(SurfaceInteraction *)&local_138.__align,ray,lambda,
                       (CameraHandle *)&local_320,local_2d8,(SamplerHandle *)&local_328);
            auVar132 = in_ZMM12._0_16_;
            auVar131 = in_ZMM10._0_16_;
            if (((ulong)local_480.sampler & 0xffffffffffff) == 0) {
              if ((byte)local_38 == '\0') {
                LogFatal<char_const(&)[4]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                           ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
              }
              iVar113 = 2;
              SurfaceInteraction::SkipIntersection
                        ((SurfaceInteraction *)&local_138.__align,ray,(Float)local_138._248_4_);
              uVar189 = aStack_2b8._48_8_;
            }
            else {
              if ((regularize != false) && (local_612 == true)) {
                *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
                BSDF::Regularize((BSDF *)&local_480);
              }
              *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
              local_2d0._0_4_ = 2.8026e-45;
              local_2d0._4_4_ = local_4e8.values.values[0];
              local_2d0._8_4_ = local_4e8.values.values[1];
              local_2d0._12_4_ = local_4e8.values.values[2];
              local_2d0._16_4_ = local_4e8.values.values[3];
              aStack_2b8._64_4_ = (undefined4)local_138._64_8_;
              aStack_2b8._68_4_ = (undefined4)((ulong)local_138._64_8_ >> 0x20);
              aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = local_138._0_4_;
              aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = local_138._4_4_;
              aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = local_138._8_4_;
              aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = local_138._12_4_;
              aStack_2b8._16_16_ = local_138._16_16_;
              aStack_2b8.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y =
                   local_138._32_4_;
              aStack_2b8.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z =
                   local_138._36_4_;
              aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x =
                   local_138._40_4_;
              aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y =
                   local_138._44_4_;
              aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                   local_138._48_4_;
              aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                   local_138._52_4_;
              aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                   local_138._56_4_;
              aStack_2b8._60_4_ = local_138._60_4_;
              aStack_2b8.ei.super_Interaction.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits = (MediumHandle)(MediumHandle)local_138._72_8_;
              in_ZmmResult._48_4_ = local_138._128_4_;
              in_ZmmResult._0_48_ = local_138._80_48_;
              in_ZmmResult._52_4_ = local_138._132_4_;
              in_ZmmResult._56_4_ = local_138._136_4_;
              in_ZmmResult._60_4_ = local_138._140_4_;
              aStack_2b8._144_8_ = local_138._144_8_;
              aStack_2b8.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
                   (float)local_138._152_8_;
              aStack_2b8.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
                   (float)((ulong)local_138._152_8_ >> 0x20);
              aStack_2b8._160_8_ = local_138._160_8_;
              aStack_2b8._168_8_ = local_138._168_8_;
              aStack_2b8._176_8_ = local_138._176_8_;
              aStack_2b8._184_8_ = local_138._184_8_;
              aStack_2b8.si.dpdu.super_Tuple3<pbrt::Vector3,_float> = local_138._80_12_;
              aStack_2b8.mi.sigma_a.values.values[1] = local_138._92_4_;
              aStack_2b8._96_8_ = local_138._96_8_;
              aStack_2b8._104_8_ = local_138._104_8_;
              aStack_2b8._112_8_ = local_138._112_8_;
              aStack_2b8._120_8_ = local_138._120_8_;
              aStack_2b8.mi.sigma_maj.values.values[2] = (float)local_138._128_4_;
              aStack_2b8.mi.sigma_maj.values.values[3] = (float)local_138._132_4_;
              aStack_2b8.mi.Le.values.values[0] = (float)local_138._136_4_;
              aStack_2b8.mi.Le.values.values[1] = (float)local_138._140_4_;
              aStack_2b8.si.material.
              super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
              .bits = (MaterialHandle)(MaterialHandle)local_138._192_8_;
              aStack_2b8.si.areaLight.
              super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
              .bits = (LightHandle)(LightHandle)local_138._200_8_;
              aStack_2b8._240_8_ = local_138._240_8_;
              aStack_2b8._208_8_ = local_138._208_8_;
              aStack_2b8._216_8_ = local_138._216_8_;
              aStack_2b8._224_8_ = local_138._224_8_;
              aStack_2b8._232_8_ = local_138._232_8_;
              local_1c0.
              super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
              .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                       )(TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                         )local_480.sampler;
              auStack_1b8._8_8_ = local_480.beta;
              auStack_1b8._0_8_ = local_480.terminated;
              auVar103._16_8_ = local_480.vertex;
              auVar103._0_16_ = auStack_1b8;
              auVar103._24_8_ = local_480.pdfFwd;
              auVar104._8_8_ = local_480.pdfFwd;
              auVar104._0_8_ = local_480.vertex;
              auVar104._16_8_ = local_480.prev;
              auVar104._24_8_ = local_480.bounces;
              auStack_198 = auVar104._16_16_;
              local_1a8 = auVar103._16_16_;
              local_188 = false;
              local_184._0_4_ = 0.0;
              local_184._4_4_ = 0.0;
              in_ZMM10 = ZEXT1664(auVar131);
              in_ZMM12 = ZEXT1664(auVar132);
              FVar149 = Vertex::ConvertDensity(local_500,local_5ec,(Vertex *)local_2d0);
              local_184._0_4_ = FVar149;
              memcpy(local_550,(Vertex *)local_2d0,0x158);
              local_60c = local_60c + 1;
              iVar113 = 3;
              uVar189 = (float **)
                        CONCAT44(aStack_2b8.ei.super_Interaction.uv.
                                 super_Tuple2<pbrt::Point2,_float>.x,
                                 aStack_2b8.ei.super_Interaction.n.
                                 super_Tuple3<pbrt::Normal3,_float>.z);
              if (local_60c < maxDepth) {
                _fStack_3c0 = 0;
                local_3c8 = (undefined1  [8])local_138._28_8_;
                local_608._0_4_ = local_138._36_4_;
                uVar123 = (sampler->
                          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                          ).bits;
                local_2d0._0_4_ = (undefined4)uVar123;
                local_2d0._4_4_ = (undefined4)(uVar123 >> 0x20);
                FVar149 = DispatchSplit<9>::operator()
                                    ((DispatchSplit<9> *)local_5d8,local_2d0,uVar123 >> 0x30);
                local_5e8._0_4_ = FVar149;
                uVar123 = (sampler->
                          super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                          ).bits;
                this = (DebugMLTSampler *)(uVar123 & 0xffffffffffff);
                uVar101 = (ushort)(uVar123 >> 0x30);
                if (uVar123 >> 0x30 < 5) {
                  if (uVar123 < 0x3000000000000) {
                    if (uVar101 == 2) {
                      u2 = (Tuple2<pbrt::Point2,_float>)
                           StratifiedSampler::Get2D((StratifiedSampler *)this);
                    }
                    else {
                      u2 = (Tuple2<pbrt::Point2,_float>)RandomSampler::Get2D((RandomSampler *)this);
                    }
                  }
                  else if (uVar101 == 3) {
                    u2 = (Tuple2<pbrt::Point2,_float>)HaltonSampler::Get2D((HaltonSampler *)this);
                  }
                  else {
                    u2 = (Tuple2<pbrt::Point2,_float>)
                         PaddedSobolSampler::Get2D((PaddedSobolSampler *)this);
                  }
                }
                else if (uVar101 < 7) {
                  if (uVar101 == 6) {
                    u2 = (Tuple2<pbrt::Point2,_float>)ZSobolSampler::Get2D((ZSobolSampler *)this);
                  }
                  else {
                    u2 = (Tuple2<pbrt::Point2,_float>)SobolSampler::Get2D((SobolSampler *)this);
                  }
                }
                else if (uVar123 >> 0x30 == 8) {
                  u2 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)this);
                }
                else if (uVar101 == 7) {
                  u2 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)this);
                }
                else {
                  local_518._0_4_ = DebugMLTSampler::Get1D(this);
                  local_518._4_4_ = extraout_XMM0_Db;
                  local_518._8_4_ = extraout_XMM0_Dc;
                  local_518._12_4_ = extraout_XMM0_Dd;
                  auVar188._0_4_ = DebugMLTSampler::Get1D(this);
                  auVar188._4_60_ = extraout_var_01;
                  auVar131 = vinsertps_avx(local_518,auVar188._0_16_,0x10);
                  u2 = auVar131._0_8_;
                }
                auVar178 = _local_3c8;
                woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_608._0_4_;
                woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_3c8._0_4_;
                woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_3c8._4_4_;
                _local_3c8 = auVar178;
                BSDF::Sample_f((optional<pbrt::BSDFSample> *)local_5d8,(BSDF *)&local_480,
                               woRender_00,(Float)local_5e8._0_4_,(Point2f)u2,mode,All);
                auVar132 = in_ZMM12._0_16_;
                auVar131 = in_ZMM10._0_16_;
                iVar113 = 3;
                if (local_5ac != false) {
                  auVar175._4_4_ = afStack_5cc[4];
                  auVar175._0_4_ = afStack_5cc[4];
                  auVar175._8_4_ = afStack_5cc[4];
                  auVar175._12_4_ = afStack_5cc[4];
                  local_5ec = afStack_5cc[4];
                  local_612 = (bool)(local_612 | ((uint)afStack_5cc[5] & 0x10) == 0);
                  auVar128 = vfmadd132ss_fma(ZEXT416((uint)local_138._132_4_),
                                             ZEXT416((uint)((float)local_138._136_4_ *
                                                           afStack_5cc[3])),
                                             ZEXT416((uint)afStack_5cc[2]));
                  auVar130 = vfmsub213ss_fma(ZEXT416((uint)local_138._136_4_),
                                             ZEXT416((uint)afStack_5cc[3]),
                                             ZEXT416((uint)((float)local_138._136_4_ *
                                                           afStack_5cc[3])));
                  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(auVar128._0_4_ + auVar130._0_4_)),
                                             ZEXT416((uint)local_138._128_4_),
                                             ZEXT416((uint)afStack_5cc[1]));
                  uVar273 = auVar128._0_4_;
                  auVar264._4_4_ = uVar273;
                  auVar264._0_4_ = uVar273;
                  auVar264._8_4_ = uVar273;
                  auVar264._12_4_ = uVar273;
                  auVar20._8_4_ = 0x7fffffff;
                  auVar20._0_8_ = 0x7fffffff7fffffff;
                  auVar20._12_4_ = 0x7fffffff;
                  in_ZmmResult._0_16_ = vandps_avx512vl(auVar264,auVar20);
                  auVar265._0_4_ = in_ZmmResult._0_4_ * (float)local_5d8._0_4_;
                  auVar265._4_4_ = in_ZmmResult._4_4_ * (float)local_5d8._4_4_;
                  auVar265._8_4_ = in_ZmmResult._8_4_ * fStack_5d0;
                  auVar265._12_4_ = in_ZmmResult._12_4_ * afStack_5cc[0];
                  auVar128 = vdivps_avx(auVar265,auVar175);
                  local_4e8.values.values[1] = auVar128._4_4_ * local_4e8.values.values[1];
                  local_4e8.values.values[0] = auVar128._0_4_ * local_4e8.values.values[0];
                  local_4e8.values.values[2] = auVar128._8_4_ * local_4e8.values.values[2];
                  local_4e8.values.values[3] = auVar128._12_4_ * local_4e8.values.values[3];
                  wi.super_Tuple3<pbrt::Vector3,_float>.y = afStack_5cc[2];
                  wi.super_Tuple3<pbrt::Vector3,_float>.x = afStack_5cc[1];
                  wi.super_Tuple3<pbrt::Vector3,_float>.z = afStack_5cc[3];
                  SurfaceInteraction::SpawnRay
                            ((RayDifferential *)local_2d0,(SurfaceInteraction *)&local_138.__align,
                             ray,(BSDF *)&local_480,wi,(int)afStack_5cc[5],afStack_5cc[6]);
                  auVar128 = aStack_2b8._16_16_;
                  (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2d0._12_4_;
                  (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_2d0._16_4_;
                  *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
                       CONCAT44(aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low,local_2d0._20_4_);
                  (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_2d0._0_4_;
                  (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_2d0._4_4_;
                  *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
                       CONCAT44(local_2d0._12_4_,local_2d0._8_4_);
                  (ray->super_Ray).medium.
                  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                  .bits = CONCAT44(aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high,
                                   aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low);
                  IVar4.high = aStack_2b8.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>
                               .z;
                  IVar4.low = aStack_2b8.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.
                              y;
                  IVar105.high = aStack_2b8.ei.super_Interaction.n.
                                 super_Tuple3<pbrt::Normal3,_float>.y;
                  IVar105.low = aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>
                                .x;
                  *(ulong *)&local_2e8[2].high =
                       CONCAT44(aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>
                                .x,aStack_2b8.ei.super_Interaction.wo.
                                   super_Tuple3<pbrt::Vector3,_float>.z);
                  *(ulong *)&local_2e8[3].high =
                       CONCAT44(aStack_2b8.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>
                                .z,aStack_2b8.ei.super_Interaction.n.
                                   super_Tuple3<pbrt::Normal3,_float>.y);
                  *(ulong *)&local_2e8[4].high =
                       CONCAT44(aStack_2b8.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>
                                .y,aStack_2b8.ei.super_Interaction.uv.
                                   super_Tuple2<pbrt::Point2,_float>.x);
                  *(ulong *)&local_2e8[5].high = CONCAT44(aStack_2b8._64_4_,aStack_2b8._60_4_);
                  *local_2e8 = aStack_2b8.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
                  local_2e8[1].low = (Float)aStack_2b8._24_4_;
                  local_2e8[1].high =
                       aStack_2b8.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
                  local_2e8[2] = IVar4;
                  local_2e8[3] = IVar105;
                  aStack_2b8._16_16_ = auVar128;
                  if (local_5ac == false) {
LAB_0040773c:
                    LogFatal<char_const(&)[4]>
                              (Fatal,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                               ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
                  }
                  woRender.super_Tuple3<pbrt::Vector3,_float>.y = afStack_5cc[2];
                  woRender.super_Tuple3<pbrt::Vector3,_float>.x = afStack_5cc[1];
                  woRender.super_Tuple3<pbrt::Vector3,_float>.z = afStack_5cc[3];
                  in_ZMM10 = ZEXT1664(auVar131);
                  in_ZMM12 = ZEXT1664(auVar132);
                  wiRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_3c8;
                  wiRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_608._0_4_;
                  FVar149 = BSDF::PDF((BSDF *)&local_480,woRender,wiRender,local_3ec,All);
                  if (local_5ac != true) goto LAB_0040773c;
                  if (((uint)afStack_5cc[5] & 0x10) != 0) {
                    local_550->delta = true;
                    local_5ec = 0.0;
                    FVar149 = 0.0;
                  }
                  FVar149 = Vertex::ConvertDensity(local_550,FVar149,local_500);
                  local_550[-1].pdfRev = FVar149;
                  iVar113 = 0;
                }
                uVar189 = (float **)
                          CONCAT44(aStack_2b8.ei.super_Interaction.uv.
                                   super_Tuple2<pbrt::Point2,_float>.x,
                                   aStack_2b8.ei.super_Interaction.n.
                                   super_Tuple3<pbrt::Normal3,_float>.z);
                if (local_5ac == true) {
                  local_5ac = false;
                  uVar189 = (float **)
                            CONCAT44(aStack_2b8.ei.super_Interaction.uv.
                                     super_Tuple2<pbrt::Point2,_float>.x,
                                     aStack_2b8.ei.super_Interaction.n.
                                     super_Tuple3<pbrt::Normal3,_float>.z);
                }
              }
            }
          }
        }
      }
      if ((byte)local_38 == '\x01') {
        local_38 = local_38 & 0xffffffffffffff00;
      }
    } while ((iVar113 == 0) || (iVar113 == 2));
    if (iVar113 == 3) {
LAB_004076f2:
      local_3e8 = local_60c;
    }
  }
  return local_3e8;
}

Assistant:

int RandomWalk(const Integrator &integrator, SampledWavelengths &lambda,
               RayDifferential ray, SamplerHandle sampler, CameraHandle camera,
               ScratchBuffer &scratchBuffer, SampledSpectrum beta, Float pdf,
               int maxDepth, TransportMode mode, Vertex *path, bool regularize) {
    if (maxDepth == 0)
        return 0;
    // Follow random walk to initialize BDPT path vertices
    int bounces = 0;
    bool anyNonSpecularBounces = false;
    Float pdfFwd = pdf;
    while (true) {
        // Attempt to create the next subpath vertex in _path_
        PBRT_DBG("%s\n", StringPrintf("Random walk. Bounces %d, beta %s, pdfFwd %f",
                                      bounces, beta, pdfFwd)
                             .c_str());
        if (!beta)
            break;
        bool scattered = false, terminated = false;
        // Trace a ray and sample the medium, if any
        Vertex &vertex = path[bounces], &prev = path[bounces - 1];
        pstd::optional<ShapeIntersection> si = integrator.Intersect(ray);
        if (ray.medium) {
            // Sample participating medium for _RandomWalk()_ ray
            Float tMax = si ? si->tHit : Infinity;
            RNG rng(Hash(ray.d.x), Hash(ray.d.y));
            Float u = sampler.Get1D();
            SampledSpectrum Tmaj = ray.medium.SampleTmaj(
                ray, tMax, u, rng, lambda, [&](const MediumSample &ms) {
                    const MediumInteraction &intr = ms.intr;
                    // Compute medium event probabilities for interaction
                    Float pAbsorb = intr.sigma_a[0] / intr.sigma_maj[0];
                    Float pScatter = intr.sigma_s[0] / intr.sigma_maj[0];
                    Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                    // Randomly sample medium event for _RandomRalk()_ ray
                    Float um = sampler.Get1D();
                    int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, um);
                    if (mode == 0) {
                        // Handle absorption for _RandomWalk()_ ray
                        terminated = true;
                        return false;

                    } else if (mode == 1) {
                        // Handle scattering for _RandomWalk()_ ray
                        beta *= ms.Tmaj * intr.sigma_s / (ms.Tmaj[0] * intr.sigma_s[0]);
                        // Record medium interaction in _path_ and compute forward density
                        vertex = Vertex::CreateMedium(intr, beta, pdfFwd, prev);
                        if (++bounces >= maxDepth) {
                            terminated = true;
                            return false;
                        }

                        // Sample direction and compute reverse density at preceding
                        // vertex
                        pstd::optional<PhaseFunctionSample> ps =
                            intr.phase.Sample_p(-ray.d, sampler.Get2D());
                        if (!ps || ps->pdf == 0) {
                            terminated = true;
                            return false;
                        }
                        // Update path state and previous path verex after medium
                        // scattering
                        pdfFwd = ps->pdf;
                        beta *= ps->p / ps->pdf;
                        ray = intr.SpawnRay(ps->wi);
                        anyNonSpecularBounces = true;
                        prev.pdfRev = vertex.ConvertDensity(ps->pdf, prev);

                        scattered = true;
                        return false;

                    } else {
                        // Handle null scattering for _RandomWalk()_ ray
                        SampledSpectrum sigma_n = intr.sigma_n();
                        beta *= ms.Tmaj * sigma_n / (ms.Tmaj[0] * sigma_n[0]);
                        return true;
                    }
                });
            // Update _beta_ for medium transmittance
            if (!scattered)
                beta *= Tmaj / Tmaj[0];
        }

        if (terminated)
            return bounces;
        if (scattered)
            continue;
        // Handle escaped rays after no medium scattering event
        if (!si) {
            // Capture escaped rays when tracing from the camera
            if (mode == TransportMode::Radiance) {
                vertex = Vertex::CreateLight(EndpointInteraction(ray), beta, pdfFwd);
                ++bounces;
            }

            break;
        }

        // Handle surface interaction for path generation
        SurfaceInteraction &isect = si->intr;
        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        ++totalBSDFs;
        // Initialize _vertex_ with surface intersection information
        vertex = Vertex::CreateSurface(isect, bsdf, beta, pdfFwd, prev);

        if (++bounces >= maxDepth)
            break;
        // Sample BSDF at current vertex
        Vector3f wo = isect.wo;
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D(), mode);
        if (!bs)
            break;
        pdfFwd = bs->pdf;
        anyNonSpecularBounces |= !bs->IsSpecular();
        beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);

        // Compute path probabilities at surface vertex
        // TODO: confirm. I believe that !mode is right. Interestingly,
        // it makes no difference in the test suite either way.
        Float pdfRev = bsdf.PDF(bs->wi, wo, !mode);
        if (bs->IsSpecular()) {
            vertex.delta = true;
            pdfRev = pdfFwd = 0;
        }
        PBRT_DBG("%s\n",
                 StringPrintf("Random walk beta after shading normal correction %s", beta)
                     .c_str());
        prev.pdfRev = vertex.ConvertDensity(pdfRev, prev);
    }
    return bounces;
}